

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Tags.cpp
# Opt level: O3

void __thiscall TagsImp::sanitizeTags(TagsImp *this,string *fmt)

{
  pointer ppPVar1;
  Core *this_00;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *pvVar2;
  Plugin **plugin;
  pointer ppPVar3;
  string_view tag;
  string_view tag_00;
  string_view tag_01;
  string_view tag_02;
  string_view tag_03;
  string_view tag_04;
  string_view tag_05;
  string_view tag_06;
  string_view tag_07;
  string_view tag_08;
  string_view tag_09;
  string_view tag_10;
  string_view tag_11;
  string_view tag_12;
  string_view tag_13;
  string_view tag_14;
  string_view tag_15;
  string_view tag_16;
  string_view tag_17;
  string_view tag_18;
  string_view tag_19;
  string_view tag_20;
  string_view tag_21;
  string_view tag_22;
  string_view tag_23;
  string_view tag_24;
  string_view tag_25;
  string_view tag_26;
  string_view tag_27;
  string_view tag_28;
  string_view tag_29;
  string_view tag_30;
  string_view tag_31;
  string_view tag_32;
  string_view tag_33;
  string_view tag_34;
  string_view tag_35;
  string_view tag_36;
  string_view tag_37;
  string_view tag_38;
  string_view tag_39;
  string_view tag_40;
  string_view tag_41;
  string_view tag_42;
  string_view tag_43;
  string_view tag_44;
  string_view tag_45;
  string_view tag_46;
  string_view tag_47;
  string_view tag_48;
  string_view tag_49;
  string_view tag_50;
  string_view tag_51;
  string_view tag_52;
  string_view tag_53;
  string_view tag_54;
  string_view tag_55;
  string_view tag_56;
  string_view tag_57;
  string_view tag_58;
  string_view tag_59;
  string_view tag_60;
  string_view tag_61;
  string_view tag_62;
  string_view tag_63;
  string_view tag_64;
  string_view tag_65;
  string_view tag_66;
  string_view tag_67;
  string_view tag_68;
  string_view tag_69;
  string_view tag_70;
  string_view tag_71;
  string_view tag_72;
  string_view tag_73;
  string_view tag_74;
  string_view tag_75;
  string_view tag_76;
  string_view tag_77;
  string_view tag_78;
  string_view tag_79;
  string_view tag_80;
  string_view tag_81;
  string_view tag_82;
  string_view tag_83;
  string_view tag_84;
  string_view tag_85;
  string_view tag_86;
  string_view tag_87;
  string_view tag_88;
  string_view tag_89;
  string_view tag_90;
  string_view tag_91;
  string_view tag_92;
  string_view tag_93;
  string_view tag_94;
  string_view tag_95;
  string_view tag_96;
  string_view tag_97;
  string_view tag_98;
  string_view tag_99;
  string_view tag_x00100;
  string_view tag_x00101;
  string_view tag_x00102;
  string_view tag_x00103;
  string_view tag_x00104;
  string_view tag_x00105;
  string_view tag_x00106;
  string_view tag_x00107;
  string_view tag_x00108;
  string_view tag_x00109;
  string_view tag_x00110;
  string_view tag_x00111;
  string_view tag_x00112;
  string_view tag_x00113;
  string_view tag_x00114;
  string_view tag_x00115;
  string_view tag_x00116;
  string_view tag_x00117;
  string_view tag_x00118;
  string_view tag_x00119;
  string_view tag_x00120;
  string_view tag_x00121;
  string_view tag_x00122;
  string_view tag_x00123;
  string_view tag_x00124;
  string_view tag_x00125;
  string_view tag_x00126;
  string_view tag_x00127;
  string_view tag_x00128;
  string_view tag_x00129;
  string_view tag_x00130;
  string_view tag_x00131;
  string_view tag_x00132;
  string_view tag_x00133;
  string_view tag_x00134;
  string_view tag_x00135;
  string_view tag_x00136;
  string_view tag_x00137;
  string_view tag_x00138;
  string_view tag_x00139;
  string_view tag_x00140;
  string_view tag_x00141;
  string_view tag_x00142;
  string_view tag_x00143;
  string_view tag_x00144;
  string_view tag_x00145;
  string_view tag_x00146;
  string_view tag_x00147;
  string_view tag_x00148;
  string_view tag_x00149;
  string_view tag_x00150;
  string_view tag_x00151;
  string_view tag_x00152;
  string_view tag_x00153;
  string_view tag_x00154;
  string_view tag_x00155;
  string_view tag_x00156;
  string_view tag_x00157;
  string_view tag_x00158;
  string_view tag_x00159;
  string_view tag_x00160;
  string_view tag_x00161;
  string_view tag_x00162;
  string_view tag_x00163;
  string_view tag_x00164;
  string_view tag_x00165;
  string_view tag_x00166;
  string_view tag_x00167;
  string_view tag_x00168;
  string_view internal_tag;
  string_view internal_tag_00;
  string_view internal_tag_01;
  string_view internal_tag_02;
  string_view internal_tag_03;
  string_view internal_tag_04;
  string_view internal_tag_05;
  string_view internal_tag_06;
  string_view internal_tag_07;
  string_view internal_tag_08;
  string_view internal_tag_09;
  string_view internal_tag_10;
  string_view internal_tag_11;
  string_view internal_tag_12;
  string_view internal_tag_13;
  string_view internal_tag_14;
  string_view internal_tag_15;
  string_view internal_tag_16;
  string_view internal_tag_17;
  string_view internal_tag_18;
  string_view internal_tag_19;
  string_view internal_tag_20;
  string_view internal_tag_21;
  string_view internal_tag_22;
  string_view internal_tag_23;
  string_view internal_tag_24;
  string_view internal_tag_25;
  string_view internal_tag_26;
  string_view internal_tag_27;
  string_view internal_tag_28;
  string_view internal_tag_29;
  string_view internal_tag_30;
  string_view internal_tag_31;
  string_view internal_tag_32;
  string_view internal_tag_33;
  string_view internal_tag_34;
  string_view internal_tag_35;
  string_view internal_tag_36;
  string_view internal_tag_37;
  string_view internal_tag_38;
  string_view internal_tag_39;
  string_view internal_tag_40;
  string_view internal_tag_41;
  string_view internal_tag_42;
  string_view internal_tag_43;
  string_view internal_tag_44;
  string_view internal_tag_45;
  string_view internal_tag_46;
  string_view internal_tag_47;
  string_view internal_tag_48;
  string_view internal_tag_49;
  string_view internal_tag_50;
  string_view internal_tag_51;
  string_view internal_tag_52;
  string_view internal_tag_53;
  string_view internal_tag_54;
  string_view internal_tag_55;
  string_view internal_tag_56;
  string_view internal_tag_57;
  string_view internal_tag_58;
  string_view internal_tag_59;
  string_view internal_tag_60;
  string_view internal_tag_61;
  string_view internal_tag_62;
  string_view internal_tag_63;
  string_view internal_tag_64;
  string_view internal_tag_65;
  string_view internal_tag_66;
  string_view internal_tag_67;
  string_view internal_tag_68;
  string_view internal_tag_69;
  string_view internal_tag_70;
  string_view internal_tag_71;
  string_view internal_tag_72;
  string_view internal_tag_73;
  string_view internal_tag_74;
  string_view internal_tag_75;
  string_view internal_tag_76;
  string_view internal_tag_77;
  string_view internal_tag_78;
  string_view internal_tag_79;
  string_view internal_tag_80;
  string_view internal_tag_81;
  string_view internal_tag_82;
  string_view internal_tag_83;
  string_view internal_tag_84;
  string_view internal_tag_85;
  string_view internal_tag_86;
  string_view internal_tag_87;
  string_view internal_tag_88;
  string_view internal_tag_89;
  string_view internal_tag_90;
  string_view internal_tag_91;
  string_view internal_tag_92;
  string_view internal_tag_93;
  string_view internal_tag_94;
  string_view internal_tag_95;
  string_view internal_tag_96;
  string_view internal_tag_97;
  string_view internal_tag_98;
  string_view internal_tag_99;
  string_view internal_tag_x00100;
  string_view internal_tag_x00101;
  string_view internal_tag_x00102;
  string_view internal_tag_x00103;
  string_view internal_tag_x00104;
  string_view internal_tag_x00105;
  string_view internal_tag_x00106;
  string_view internal_tag_x00107;
  string_view internal_tag_x00108;
  string_view internal_tag_x00109;
  string_view internal_tag_x00110;
  string_view internal_tag_x00111;
  string_view internal_tag_x00112;
  string_view internal_tag_x00113;
  string_view internal_tag_x00114;
  string_view internal_tag_x00115;
  string_view internal_tag_x00116;
  string_view internal_tag_x00117;
  string_view internal_tag_x00118;
  string_view internal_tag_x00119;
  string_view internal_tag_x00120;
  string_view internal_tag_x00121;
  string_view internal_tag_x00122;
  string_view internal_tag_x00123;
  string_view internal_tag_x00124;
  string_view internal_tag_x00125;
  string_view internal_tag_x00126;
  string_view internal_tag_x00127;
  string_view internal_tag_x00128;
  string_view internal_tag_x00129;
  string_view internal_tag_x00130;
  string_view internal_tag_x00131;
  string_view internal_tag_x00132;
  string_view internal_tag_x00133;
  string_view internal_tag_x00134;
  string_view internal_tag_x00135;
  string_view internal_tag_x00136;
  string_view internal_tag_x00137;
  string_view internal_tag_x00138;
  string_view internal_tag_x00139;
  string_view internal_tag_x00140;
  string_view internal_tag_x00141;
  string_view internal_tag_x00142;
  string_view internal_tag_x00143;
  string_view internal_tag_x00144;
  string_view internal_tag_x00145;
  string_view internal_tag_x00146;
  string_view internal_tag_x00147;
  string_view internal_tag_x00148;
  string_view internal_tag_x00149;
  string_view internal_tag_x00150;
  string_view internal_tag_x00151;
  string_view internal_tag_x00152;
  string_view internal_tag_x00153;
  string_view internal_tag_x00154;
  string_view internal_tag_x00155;
  string_view internal_tag_x00156;
  string_view internal_tag_x00157;
  string_view internal_tag_x00158;
  string_view internal_tag_x00159;
  string_view internal_tag_x00160;
  string_view internal_tag_x00161;
  string_view internal_tag_x00162;
  string_view internal_tag_x00163;
  string_view internal_tag_x00164;
  string_view internal_tag_x00165;
  string_view internal_tag_x00166;
  string_view internal_tag_x00167;
  string_view internal_tag_x00168;
  
  tag._M_str = (this->super_Tags).dateTag._M_dataplus._M_p;
  tag._M_len = (this->super_Tags).dateTag._M_string_length;
  internal_tag._M_str = (this->super_Tags).INTERNAL_DATE_TAG._M_dataplus._M_p;
  internal_tag._M_len = (this->super_Tags).INTERNAL_DATE_TAG._M_string_length;
  RenX::replace_tag(fmt,tag,internal_tag);
  tag_00._M_str = (this->super_Tags).timeTag._M_dataplus._M_p;
  tag_00._M_len = (this->super_Tags).timeTag._M_string_length;
  internal_tag_00._M_str = (this->super_Tags).INTERNAL_TIME_TAG._M_dataplus._M_p;
  internal_tag_00._M_len = (this->super_Tags).INTERNAL_TIME_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_00,internal_tag_00);
  tag_01._M_str = (this->super_Tags).rconVersionTag._M_dataplus._M_p;
  tag_01._M_len = (this->super_Tags).rconVersionTag._M_string_length;
  internal_tag_01._M_str = (this->super_Tags).INTERNAL_RCON_VERSION_TAG._M_dataplus._M_p;
  internal_tag_01._M_len = (this->super_Tags).INTERNAL_RCON_VERSION_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_01,internal_tag_01);
  tag_02._M_str = (this->super_Tags).gameVersionTag._M_dataplus._M_p;
  tag_02._M_len = (this->super_Tags).gameVersionTag._M_string_length;
  internal_tag_02._M_str = (this->super_Tags).INTERNAL_GAME_VERSION_TAG._M_dataplus._M_p;
  internal_tag_02._M_len = (this->super_Tags).INTERNAL_GAME_VERSION_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_02,internal_tag_02);
  tag_03._M_str = (this->super_Tags).rulesTag._M_dataplus._M_p;
  tag_03._M_len = (this->super_Tags).rulesTag._M_string_length;
  internal_tag_03._M_str = (this->super_Tags).INTERNAL_RULES_TAG._M_dataplus._M_p;
  internal_tag_03._M_len = (this->super_Tags).INTERNAL_RULES_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_03,internal_tag_03);
  tag_04._M_str = (this->super_Tags).userTag._M_dataplus._M_p;
  tag_04._M_len = (this->super_Tags).userTag._M_string_length;
  internal_tag_04._M_str = (this->super_Tags).INTERNAL_USER_TAG._M_dataplus._M_p;
  internal_tag_04._M_len = (this->super_Tags).INTERNAL_USER_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_04,internal_tag_04);
  tag_05._M_str = (this->super_Tags).serverNameTag._M_dataplus._M_p;
  tag_05._M_len = (this->super_Tags).serverNameTag._M_string_length;
  internal_tag_05._M_str = (this->super_Tags).INTERNAL_SERVER_NAME_TAG._M_dataplus._M_p;
  internal_tag_05._M_len = (this->super_Tags).INTERNAL_SERVER_NAME_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_05,internal_tag_05);
  tag_06._M_str = (this->super_Tags).mapTag._M_dataplus._M_p;
  tag_06._M_len = (this->super_Tags).mapTag._M_string_length;
  internal_tag_06._M_str = (this->super_Tags).INTERNAL_MAP_TAG._M_dataplus._M_p;
  internal_tag_06._M_len = (this->super_Tags).INTERNAL_MAP_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_06,internal_tag_06);
  tag_07._M_str = (this->super_Tags).mapGUIDTag._M_dataplus._M_p;
  tag_07._M_len = (this->super_Tags).mapGUIDTag._M_string_length;
  internal_tag_07._M_str = (this->super_Tags).INTERNAL_MAP_GUID_TAG._M_dataplus._M_p;
  internal_tag_07._M_len = (this->super_Tags).INTERNAL_MAP_GUID_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_07,internal_tag_07);
  tag_08._M_str = (this->super_Tags).serverHostnameTag._M_dataplus._M_p;
  tag_08._M_len = (this->super_Tags).serverHostnameTag._M_string_length;
  internal_tag_08._M_str = (this->super_Tags).INTERNAL_SERVER_HOSTNAME_TAG._M_dataplus._M_p;
  internal_tag_08._M_len = (this->super_Tags).INTERNAL_SERVER_HOSTNAME_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_08,internal_tag_08);
  tag_09._M_str = (this->super_Tags).serverPortTag._M_dataplus._M_p;
  tag_09._M_len = (this->super_Tags).serverPortTag._M_string_length;
  internal_tag_09._M_str = (this->super_Tags).INTERNAL_SERVER_PORT_TAG._M_dataplus._M_p;
  internal_tag_09._M_len = (this->super_Tags).INTERNAL_SERVER_PORT_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_09,internal_tag_09);
  tag_10._M_str = (this->super_Tags).socketHostnameTag._M_dataplus._M_p;
  tag_10._M_len = (this->super_Tags).socketHostnameTag._M_string_length;
  internal_tag_10._M_str = (this->super_Tags).INTERNAL_SOCKET_HOSTNAME_TAG._M_dataplus._M_p;
  internal_tag_10._M_len = (this->super_Tags).INTERNAL_SOCKET_HOSTNAME_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_10,internal_tag_10);
  tag_11._M_str = (this->super_Tags).socketPortTag._M_dataplus._M_p;
  tag_11._M_len = (this->super_Tags).socketPortTag._M_string_length;
  internal_tag_11._M_str = (this->super_Tags).INTERNAL_SOCKET_PORT_TAG._M_dataplus._M_p;
  internal_tag_11._M_len = (this->super_Tags).INTERNAL_SOCKET_PORT_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_11,internal_tag_11);
  tag_12._M_str = (this->super_Tags).serverPrefixTag._M_dataplus._M_p;
  tag_12._M_len = (this->super_Tags).serverPrefixTag._M_string_length;
  internal_tag_12._M_str = (this->super_Tags).INTERNAL_SERVER_PREFIX_TAG._M_dataplus._M_p;
  internal_tag_12._M_len = (this->super_Tags).INTERNAL_SERVER_PREFIX_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_12,internal_tag_12);
  tag_13._M_str = (this->super_Tags).nameTag._M_dataplus._M_p;
  tag_13._M_len = (this->super_Tags).nameTag._M_string_length;
  internal_tag_13._M_str = (this->super_Tags).INTERNAL_NAME_TAG._M_dataplus._M_p;
  internal_tag_13._M_len = (this->super_Tags).INTERNAL_NAME_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_13,internal_tag_13);
  tag_14._M_str = (this->super_Tags).rawNameTag._M_dataplus._M_p;
  tag_14._M_len = (this->super_Tags).rawNameTag._M_string_length;
  internal_tag_14._M_str = (this->super_Tags).INTERNAL_RAW_NAME_TAG._M_dataplus._M_p;
  internal_tag_14._M_len = (this->super_Tags).INTERNAL_RAW_NAME_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_14,internal_tag_14);
  tag_15._M_str = (this->super_Tags).ipTag._M_dataplus._M_p;
  tag_15._M_len = (this->super_Tags).ipTag._M_string_length;
  internal_tag_15._M_str = (this->super_Tags).INTERNAL_IP_TAG._M_dataplus._M_p;
  internal_tag_15._M_len = (this->super_Tags).INTERNAL_IP_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_15,internal_tag_15);
  tag_16._M_str = (this->super_Tags).hwidTag._M_dataplus._M_p;
  tag_16._M_len = (this->super_Tags).hwidTag._M_string_length;
  internal_tag_16._M_str = (this->super_Tags).INTERNAL_HWID_TAG._M_dataplus._M_p;
  internal_tag_16._M_len = (this->super_Tags).INTERNAL_HWID_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_16,internal_tag_16);
  tag_17._M_str = (this->super_Tags).rdnsTag._M_dataplus._M_p;
  tag_17._M_len = (this->super_Tags).rdnsTag._M_string_length;
  internal_tag_17._M_str = (this->super_Tags).INTERNAL_RDNS_TAG._M_dataplus._M_p;
  internal_tag_17._M_len = (this->super_Tags).INTERNAL_RDNS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_17,internal_tag_17);
  tag_18._M_str = (this->super_Tags).steamTag._M_dataplus._M_p;
  tag_18._M_len = (this->super_Tags).steamTag._M_string_length;
  internal_tag_18._M_str = (this->super_Tags).INTERNAL_STEAM_TAG._M_dataplus._M_p;
  internal_tag_18._M_len = (this->super_Tags).INTERNAL_STEAM_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_18,internal_tag_18);
  tag_19._M_str = (this->super_Tags).uuidTag._M_dataplus._M_p;
  tag_19._M_len = (this->super_Tags).uuidTag._M_string_length;
  internal_tag_19._M_str = (this->super_Tags).INTERNAL_UUID_TAG._M_dataplus._M_p;
  internal_tag_19._M_len = (this->super_Tags).INTERNAL_UUID_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_19,internal_tag_19);
  tag_20._M_str = (this->super_Tags).idTag._M_dataplus._M_p;
  tag_20._M_len = (this->super_Tags).idTag._M_string_length;
  internal_tag_20._M_str = (this->super_Tags).INTERNAL_ID_TAG._M_dataplus._M_p;
  internal_tag_20._M_len = (this->super_Tags).INTERNAL_ID_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_20,internal_tag_20);
  tag_21._M_str = (this->super_Tags).characterTag._M_dataplus._M_p;
  tag_21._M_len = (this->super_Tags).characterTag._M_string_length;
  internal_tag_21._M_str = (this->super_Tags).INTERNAL_CHARACTER_TAG._M_dataplus._M_p;
  internal_tag_21._M_len = (this->super_Tags).INTERNAL_CHARACTER_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_21,internal_tag_21);
  tag_22._M_str = (this->super_Tags).vehicleTag._M_dataplus._M_p;
  tag_22._M_len = (this->super_Tags).vehicleTag._M_string_length;
  internal_tag_22._M_str = (this->super_Tags).INTERNAL_VEHICLE_TAG._M_dataplus._M_p;
  internal_tag_22._M_len = (this->super_Tags).INTERNAL_VEHICLE_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_22,internal_tag_22);
  tag_23._M_str = (this->super_Tags).adminTag._M_dataplus._M_p;
  tag_23._M_len = (this->super_Tags).adminTag._M_string_length;
  internal_tag_23._M_str = (this->super_Tags).INTERNAL_ADMIN_TAG._M_dataplus._M_p;
  internal_tag_23._M_len = (this->super_Tags).INTERNAL_ADMIN_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_23,internal_tag_23);
  tag_24._M_str = (this->super_Tags).prefixTag._M_dataplus._M_p;
  tag_24._M_len = (this->super_Tags).prefixTag._M_string_length;
  internal_tag_24._M_str = (this->super_Tags).INTERNAL_PREFIX_TAG._M_dataplus._M_p;
  internal_tag_24._M_len = (this->super_Tags).INTERNAL_PREFIX_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_24,internal_tag_24);
  tag_25._M_str = (this->super_Tags).gamePrefixTag._M_dataplus._M_p;
  tag_25._M_len = (this->super_Tags).gamePrefixTag._M_string_length;
  internal_tag_25._M_str = (this->super_Tags).INTERNAL_GAME_PREFIX_TAG._M_dataplus._M_p;
  internal_tag_25._M_len = (this->super_Tags).INTERNAL_GAME_PREFIX_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_25,internal_tag_25);
  tag_26._M_str = (this->super_Tags).teamColorTag._M_dataplus._M_p;
  tag_26._M_len = (this->super_Tags).teamColorTag._M_string_length;
  internal_tag_26._M_str = (this->super_Tags).INTERNAL_TEAM_COLOR_TAG._M_dataplus._M_p;
  internal_tag_26._M_len = (this->super_Tags).INTERNAL_TEAM_COLOR_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_26,internal_tag_26);
  tag_27._M_str = (this->super_Tags).teamShortTag._M_dataplus._M_p;
  tag_27._M_len = (this->super_Tags).teamShortTag._M_string_length;
  internal_tag_27._M_str = (this->super_Tags).INTERNAL_TEAM_SHORT_TAG._M_dataplus._M_p;
  internal_tag_27._M_len = (this->super_Tags).INTERNAL_TEAM_SHORT_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_27,internal_tag_27);
  tag_28._M_str = (this->super_Tags).teamLongTag._M_dataplus._M_p;
  tag_28._M_len = (this->super_Tags).teamLongTag._M_string_length;
  internal_tag_28._M_str = (this->super_Tags).INTERNAL_TEAM_LONG_TAG._M_dataplus._M_p;
  internal_tag_28._M_len = (this->super_Tags).INTERNAL_TEAM_LONG_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_28,internal_tag_28);
  tag_29._M_str = (this->super_Tags).pingTag._M_dataplus._M_p;
  tag_29._M_len = (this->super_Tags).pingTag._M_string_length;
  internal_tag_29._M_str = (this->super_Tags).INTERNAL_PING_TAG._M_dataplus._M_p;
  internal_tag_29._M_len = (this->super_Tags).INTERNAL_PING_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_29,internal_tag_29);
  tag_30._M_str = (this->super_Tags).scoreTag._M_dataplus._M_p;
  tag_30._M_len = (this->super_Tags).scoreTag._M_string_length;
  internal_tag_30._M_str = (this->super_Tags).INTERNAL_SCORE_TAG._M_dataplus._M_p;
  internal_tag_30._M_len = (this->super_Tags).INTERNAL_SCORE_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_30,internal_tag_30);
  tag_31._M_str = (this->super_Tags).scorePerMinuteTag._M_dataplus._M_p;
  tag_31._M_len = (this->super_Tags).scorePerMinuteTag._M_string_length;
  internal_tag_31._M_str = (this->super_Tags).INTERNAL_SCORE_PER_MINUTE_TAG._M_dataplus._M_p;
  internal_tag_31._M_len = (this->super_Tags).INTERNAL_SCORE_PER_MINUTE_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_31,internal_tag_31);
  tag_32._M_str = (this->super_Tags).creditsTag._M_dataplus._M_p;
  tag_32._M_len = (this->super_Tags).creditsTag._M_string_length;
  internal_tag_32._M_str = (this->super_Tags).INTERNAL_CREDITS_TAG._M_dataplus._M_p;
  internal_tag_32._M_len = (this->super_Tags).INTERNAL_CREDITS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_32,internal_tag_32);
  tag_33._M_str = (this->super_Tags).killsTag._M_dataplus._M_p;
  tag_33._M_len = (this->super_Tags).killsTag._M_string_length;
  internal_tag_33._M_str = (this->super_Tags).INTERNAL_KILLS_TAG._M_dataplus._M_p;
  internal_tag_33._M_len = (this->super_Tags).INTERNAL_KILLS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_33,internal_tag_33);
  tag_34._M_str = (this->super_Tags).deathsTag._M_dataplus._M_p;
  tag_34._M_len = (this->super_Tags).deathsTag._M_string_length;
  internal_tag_34._M_str = (this->super_Tags).INTERNAL_DEATHS_TAG._M_dataplus._M_p;
  internal_tag_34._M_len = (this->super_Tags).INTERNAL_DEATHS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_34,internal_tag_34);
  tag_35._M_str = (this->super_Tags).kdrTag._M_dataplus._M_p;
  tag_35._M_len = (this->super_Tags).kdrTag._M_string_length;
  internal_tag_35._M_str = (this->super_Tags).INTERNAL_KDR_TAG._M_dataplus._M_p;
  internal_tag_35._M_len = (this->super_Tags).INTERNAL_KDR_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_35,internal_tag_35);
  tag_36._M_str = (this->super_Tags).suicidesTag._M_dataplus._M_p;
  tag_36._M_len = (this->super_Tags).suicidesTag._M_string_length;
  internal_tag_36._M_str = (this->super_Tags).INTERNAL_SUICIDES_TAG._M_dataplus._M_p;
  internal_tag_36._M_len = (this->super_Tags).INTERNAL_SUICIDES_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_36,internal_tag_36);
  tag_37._M_str = (this->super_Tags).headshotsTag._M_dataplus._M_p;
  tag_37._M_len = (this->super_Tags).headshotsTag._M_string_length;
  internal_tag_37._M_str = (this->super_Tags).INTERNAL_HEADSHOTS_TAG._M_dataplus._M_p;
  internal_tag_37._M_len = (this->super_Tags).INTERNAL_HEADSHOTS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_37,internal_tag_37);
  tag_38._M_str = (this->super_Tags).headshotKillRatioTag._M_dataplus._M_p;
  tag_38._M_len = (this->super_Tags).headshotKillRatioTag._M_string_length;
  internal_tag_38._M_str = (this->super_Tags).INTERNAL_HEADSHOT_KILL_RATIO_TAG._M_dataplus._M_p;
  internal_tag_38._M_len = (this->super_Tags).INTERNAL_HEADSHOT_KILL_RATIO_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_38,internal_tag_38);
  tag_39._M_str = (this->super_Tags).vehicleKillsTag._M_dataplus._M_p;
  tag_39._M_len = (this->super_Tags).vehicleKillsTag._M_string_length;
  internal_tag_39._M_str = (this->super_Tags).INTERNAL_VEHICLE_KILLS_TAG._M_dataplus._M_p;
  internal_tag_39._M_len = (this->super_Tags).INTERNAL_VEHICLE_KILLS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_39,internal_tag_39);
  tag_40._M_str = (this->super_Tags).buildingKillsTag._M_dataplus._M_p;
  tag_40._M_len = (this->super_Tags).buildingKillsTag._M_string_length;
  internal_tag_40._M_str = (this->super_Tags).INTERNAL_BUILDING_KILLS_TAG._M_dataplus._M_p;
  internal_tag_40._M_len = (this->super_Tags).INTERNAL_BUILDING_KILLS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_40,internal_tag_40);
  tag_41._M_str = (this->super_Tags).defenceKillsTag._M_dataplus._M_p;
  tag_41._M_len = (this->super_Tags).defenceKillsTag._M_string_length;
  internal_tag_41._M_str = (this->super_Tags).INTERNAL_DEFENCE_KILLS_TAG._M_dataplus._M_p;
  internal_tag_41._M_len = (this->super_Tags).INTERNAL_DEFENCE_KILLS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_41,internal_tag_41);
  tag_42._M_str = (this->super_Tags).gameTimeTag._M_dataplus._M_p;
  tag_42._M_len = (this->super_Tags).gameTimeTag._M_string_length;
  internal_tag_42._M_str = (this->super_Tags).INTERNAL_GAME_TIME_TAG._M_dataplus._M_p;
  internal_tag_42._M_len = (this->super_Tags).INTERNAL_GAME_TIME_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_42,internal_tag_42);
  tag_43._M_str = (this->super_Tags).gamesTag._M_dataplus._M_p;
  tag_43._M_len = (this->super_Tags).gamesTag._M_string_length;
  internal_tag_43._M_str = (this->super_Tags).INTERNAL_GAMES_TAG._M_dataplus._M_p;
  internal_tag_43._M_len = (this->super_Tags).INTERNAL_GAMES_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_43,internal_tag_43);
  tag_44._M_str = (this->super_Tags).GDIGamesTag._M_dataplus._M_p;
  tag_44._M_len = (this->super_Tags).GDIGamesTag._M_string_length;
  internal_tag_44._M_str = (this->super_Tags).INTERNAL_GDI_GAMES_TAG._M_dataplus._M_p;
  internal_tag_44._M_len = (this->super_Tags).INTERNAL_GDI_GAMES_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_44,internal_tag_44);
  tag_45._M_str = (this->super_Tags).NodGamesTag._M_dataplus._M_p;
  tag_45._M_len = (this->super_Tags).NodGamesTag._M_string_length;
  internal_tag_45._M_str = (this->super_Tags).INTERNAL_NOD_GAMES_TAG._M_dataplus._M_p;
  internal_tag_45._M_len = (this->super_Tags).INTERNAL_NOD_GAMES_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_45,internal_tag_45);
  tag_46._M_str = (this->super_Tags).winsTag._M_dataplus._M_p;
  tag_46._M_len = (this->super_Tags).winsTag._M_string_length;
  internal_tag_46._M_str = (this->super_Tags).INTERNAL_WINS_TAG._M_dataplus._M_p;
  internal_tag_46._M_len = (this->super_Tags).INTERNAL_WINS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_46,internal_tag_46);
  tag_47._M_str = (this->super_Tags).GDIWinsTag._M_dataplus._M_p;
  tag_47._M_len = (this->super_Tags).GDIWinsTag._M_string_length;
  internal_tag_47._M_str = (this->super_Tags).INTERNAL_GDI_WINS_TAG._M_dataplus._M_p;
  internal_tag_47._M_len = (this->super_Tags).INTERNAL_GDI_WINS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_47,internal_tag_47);
  tag_48._M_str = (this->super_Tags).NodWinsTag._M_dataplus._M_p;
  tag_48._M_len = (this->super_Tags).NodWinsTag._M_string_length;
  internal_tag_48._M_str = (this->super_Tags).INTERNAL_NOD_WINS_TAG._M_dataplus._M_p;
  internal_tag_48._M_len = (this->super_Tags).INTERNAL_NOD_WINS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_48,internal_tag_48);
  tag_49._M_str = (this->super_Tags).tiesTag._M_dataplus._M_p;
  tag_49._M_len = (this->super_Tags).tiesTag._M_string_length;
  internal_tag_49._M_str = (this->super_Tags).INTERNAL_TIES_TAG._M_dataplus._M_p;
  internal_tag_49._M_len = (this->super_Tags).INTERNAL_TIES_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_49,internal_tag_49);
  tag_50._M_str = (this->super_Tags).lossesTag._M_dataplus._M_p;
  tag_50._M_len = (this->super_Tags).lossesTag._M_string_length;
  internal_tag_50._M_str = (this->super_Tags).INTERNAL_LOSSES_TAG._M_dataplus._M_p;
  internal_tag_50._M_len = (this->super_Tags).INTERNAL_LOSSES_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_50,internal_tag_50);
  tag_51._M_str = (this->super_Tags).GDILossesTag._M_dataplus._M_p;
  tag_51._M_len = (this->super_Tags).GDILossesTag._M_string_length;
  internal_tag_51._M_str = (this->super_Tags).INTERNAL_GDI_LOSSES_TAG._M_dataplus._M_p;
  internal_tag_51._M_len = (this->super_Tags).INTERNAL_GDI_LOSSES_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_51,internal_tag_51);
  tag_52._M_str = (this->super_Tags).NodLossesTag._M_dataplus._M_p;
  tag_52._M_len = (this->super_Tags).NodLossesTag._M_string_length;
  internal_tag_52._M_str = (this->super_Tags).INTERNAL_NOD_LOSSES_TAG._M_dataplus._M_p;
  internal_tag_52._M_len = (this->super_Tags).INTERNAL_NOD_LOSSES_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_52,internal_tag_52);
  tag_53._M_str = (this->super_Tags).winLossRatioTag._M_dataplus._M_p;
  tag_53._M_len = (this->super_Tags).winLossRatioTag._M_string_length;
  internal_tag_53._M_str = (this->super_Tags).INTERNAL_WIN_LOSS_RATIO_TAG._M_dataplus._M_p;
  internal_tag_53._M_len = (this->super_Tags).INTERNAL_WIN_LOSS_RATIO_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_53,internal_tag_53);
  tag_54._M_str = (this->super_Tags).GDIWinLossRatioTag._M_dataplus._M_p;
  tag_54._M_len = (this->super_Tags).GDIWinLossRatioTag._M_string_length;
  internal_tag_54._M_str = (this->super_Tags).INTERNAL_GDI_WIN_LOSS_RATIO_TAG._M_dataplus._M_p;
  internal_tag_54._M_len = (this->super_Tags).INTERNAL_GDI_WIN_LOSS_RATIO_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_54,internal_tag_54);
  tag_55._M_str = (this->super_Tags).NodWinLossRatioTag._M_dataplus._M_p;
  tag_55._M_len = (this->super_Tags).NodWinLossRatioTag._M_string_length;
  internal_tag_55._M_str = (this->super_Tags).INTERNAL_NOD_WIN_LOSS_RATIO_TAG._M_dataplus._M_p;
  internal_tag_55._M_len = (this->super_Tags).INTERNAL_NOD_WIN_LOSS_RATIO_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_55,internal_tag_55);
  tag_56._M_str = (this->super_Tags).beaconPlacementsTag._M_dataplus._M_p;
  tag_56._M_len = (this->super_Tags).beaconPlacementsTag._M_string_length;
  internal_tag_56._M_str = (this->super_Tags).INTERNAL_BEACON_PLACEMENTS_TAG._M_dataplus._M_p;
  internal_tag_56._M_len = (this->super_Tags).INTERNAL_BEACON_PLACEMENTS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_56,internal_tag_56);
  tag_57._M_str = (this->super_Tags).beaconDisarmsTag._M_dataplus._M_p;
  tag_57._M_len = (this->super_Tags).beaconDisarmsTag._M_string_length;
  internal_tag_57._M_str = (this->super_Tags).INTERNAL_BEACON_DISARMS_TAG._M_dataplus._M_p;
  internal_tag_57._M_len = (this->super_Tags).INTERNAL_BEACON_DISARMS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_57,internal_tag_57);
  tag_58._M_str = (this->super_Tags).proxyPlacementsTag._M_dataplus._M_p;
  tag_58._M_len = (this->super_Tags).proxyPlacementsTag._M_string_length;
  internal_tag_58._M_str = (this->super_Tags).INTERNAL_PROXY_PLACEMENTS_TAG._M_dataplus._M_p;
  internal_tag_58._M_len = (this->super_Tags).INTERNAL_PROXY_PLACEMENTS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_58,internal_tag_58);
  tag_59._M_str = (this->super_Tags).proxyDisarmsTag._M_dataplus._M_p;
  tag_59._M_len = (this->super_Tags).proxyDisarmsTag._M_string_length;
  internal_tag_59._M_str = (this->super_Tags).INTERNAL_PROXY_DISARMS_TAG._M_dataplus._M_p;
  internal_tag_59._M_len = (this->super_Tags).INTERNAL_PROXY_DISARMS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_59,internal_tag_59);
  tag_60._M_str = (this->super_Tags).capturesTag._M_dataplus._M_p;
  tag_60._M_len = (this->super_Tags).capturesTag._M_string_length;
  internal_tag_60._M_str = (this->super_Tags).INTERNAL_CAPTURES_TAG._M_dataplus._M_p;
  internal_tag_60._M_len = (this->super_Tags).INTERNAL_CAPTURES_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_60,internal_tag_60);
  tag_61._M_str = (this->super_Tags).stealsTag._M_dataplus._M_p;
  tag_61._M_len = (this->super_Tags).stealsTag._M_string_length;
  internal_tag_61._M_str = (this->super_Tags).INTERNAL_STEALS_TAG._M_dataplus._M_p;
  internal_tag_61._M_len = (this->super_Tags).INTERNAL_STEALS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_61,internal_tag_61);
  tag_62._M_str = (this->super_Tags).stolenTag._M_dataplus._M_p;
  tag_62._M_len = (this->super_Tags).stolenTag._M_string_length;
  internal_tag_62._M_str = (this->super_Tags).INTERNAL_STOLEN_TAG._M_dataplus._M_p;
  internal_tag_62._M_len = (this->super_Tags).INTERNAL_STOLEN_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_62,internal_tag_62);
  tag_63._M_str = (this->super_Tags).accessTag._M_dataplus._M_p;
  tag_63._M_len = (this->super_Tags).accessTag._M_string_length;
  internal_tag_63._M_str = (this->super_Tags).INTERNAL_ACCESS_TAG._M_dataplus._M_p;
  internal_tag_63._M_len = (this->super_Tags).INTERNAL_ACCESS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_63,internal_tag_63);
  tag_64._M_str = (this->super_Tags).victimNameTag._M_dataplus._M_p;
  tag_64._M_len = (this->super_Tags).victimNameTag._M_string_length;
  internal_tag_64._M_str = (this->super_Tags).INTERNAL_VICTIM_NAME_TAG._M_dataplus._M_p;
  internal_tag_64._M_len = (this->super_Tags).INTERNAL_VICTIM_NAME_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_64,internal_tag_64);
  tag_65._M_str = (this->super_Tags).victimRawNameTag._M_dataplus._M_p;
  tag_65._M_len = (this->super_Tags).victimRawNameTag._M_string_length;
  internal_tag_65._M_str = (this->super_Tags).INTERNAL_VICTIM_RAW_NAME_TAG._M_dataplus._M_p;
  internal_tag_65._M_len = (this->super_Tags).INTERNAL_VICTIM_RAW_NAME_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_65,internal_tag_65);
  tag_66._M_str = (this->super_Tags).victimIPTag._M_dataplus._M_p;
  tag_66._M_len = (this->super_Tags).victimIPTag._M_string_length;
  internal_tag_66._M_str = (this->super_Tags).INTERNAL_VICTIM_IP_TAG._M_dataplus._M_p;
  internal_tag_66._M_len = (this->super_Tags).INTERNAL_VICTIM_IP_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_66,internal_tag_66);
  tag_67._M_str = (this->super_Tags).victimHWIDTag._M_dataplus._M_p;
  tag_67._M_len = (this->super_Tags).victimHWIDTag._M_string_length;
  internal_tag_67._M_str = (this->super_Tags).INTERNAL_VICTIM_HWID_TAG._M_dataplus._M_p;
  internal_tag_67._M_len = (this->super_Tags).INTERNAL_VICTIM_HWID_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_67,internal_tag_67);
  tag_68._M_str = (this->super_Tags).victimRDNSTag._M_dataplus._M_p;
  tag_68._M_len = (this->super_Tags).victimRDNSTag._M_string_length;
  internal_tag_68._M_str = (this->super_Tags).INTERNAL_VICTIM_RDNS_TAG._M_dataplus._M_p;
  internal_tag_68._M_len = (this->super_Tags).INTERNAL_VICTIM_RDNS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_68,internal_tag_68);
  tag_69._M_str = (this->super_Tags).victimSteamTag._M_dataplus._M_p;
  tag_69._M_len = (this->super_Tags).victimSteamTag._M_string_length;
  internal_tag_69._M_str = (this->super_Tags).INTERNAL_VICTIM_STEAM_TAG._M_dataplus._M_p;
  internal_tag_69._M_len = (this->super_Tags).INTERNAL_VICTIM_STEAM_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_69,internal_tag_69);
  tag_70._M_str = (this->super_Tags).victimUUIDTag._M_dataplus._M_p;
  tag_70._M_len = (this->super_Tags).victimUUIDTag._M_string_length;
  internal_tag_70._M_str = (this->super_Tags).INTERNAL_VICTIM_UUID_TAG._M_dataplus._M_p;
  internal_tag_70._M_len = (this->super_Tags).INTERNAL_VICTIM_UUID_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_70,internal_tag_70);
  tag_71._M_str = (this->super_Tags).victimIDTag._M_dataplus._M_p;
  tag_71._M_len = (this->super_Tags).victimIDTag._M_string_length;
  internal_tag_71._M_str = (this->super_Tags).INTERNAL_VICTIM_ID_TAG._M_dataplus._M_p;
  internal_tag_71._M_len = (this->super_Tags).INTERNAL_VICTIM_ID_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_71,internal_tag_71);
  tag_72._M_str = (this->super_Tags).victimCharacterTag._M_dataplus._M_p;
  tag_72._M_len = (this->super_Tags).victimCharacterTag._M_string_length;
  internal_tag_72._M_str = (this->super_Tags).INTERNAL_VICTIM_CHARACTER_TAG._M_dataplus._M_p;
  internal_tag_72._M_len = (this->super_Tags).INTERNAL_VICTIM_CHARACTER_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_72,internal_tag_72);
  tag_73._M_str = (this->super_Tags).victimVehicleTag._M_dataplus._M_p;
  tag_73._M_len = (this->super_Tags).victimVehicleTag._M_string_length;
  internal_tag_73._M_str = (this->super_Tags).INTERNAL_VICTIM_VEHICLE_TAG._M_dataplus._M_p;
  internal_tag_73._M_len = (this->super_Tags).INTERNAL_VICTIM_VEHICLE_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_73,internal_tag_73);
  tag_74._M_str = (this->super_Tags).victimAdminTag._M_dataplus._M_p;
  tag_74._M_len = (this->super_Tags).victimAdminTag._M_string_length;
  internal_tag_74._M_str = (this->super_Tags).INTERNAL_VICTIM_ADMIN_TAG._M_dataplus._M_p;
  internal_tag_74._M_len = (this->super_Tags).INTERNAL_VICTIM_ADMIN_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_74,internal_tag_74);
  tag_75._M_str = (this->super_Tags).victimPrefixTag._M_dataplus._M_p;
  tag_75._M_len = (this->super_Tags).victimPrefixTag._M_string_length;
  internal_tag_75._M_str = (this->super_Tags).INTERNAL_VICTIM_PREFIX_TAG._M_dataplus._M_p;
  internal_tag_75._M_len = (this->super_Tags).INTERNAL_VICTIM_PREFIX_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_75,internal_tag_75);
  tag_76._M_str = (this->super_Tags).victimGamePrefixTag._M_dataplus._M_p;
  tag_76._M_len = (this->super_Tags).victimGamePrefixTag._M_string_length;
  internal_tag_76._M_str = (this->super_Tags).INTERNAL_VICTIM_GAME_PREFIX_TAG._M_dataplus._M_p;
  internal_tag_76._M_len = (this->super_Tags).INTERNAL_VICTIM_GAME_PREFIX_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_76,internal_tag_76);
  tag_77._M_str = (this->super_Tags).victimTeamColorTag._M_dataplus._M_p;
  tag_77._M_len = (this->super_Tags).victimTeamColorTag._M_string_length;
  internal_tag_77._M_str = (this->super_Tags).INTERNAL_VICTIM_TEAM_COLOR_TAG._M_dataplus._M_p;
  internal_tag_77._M_len = (this->super_Tags).INTERNAL_VICTIM_TEAM_COLOR_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_77,internal_tag_77);
  tag_78._M_str = (this->super_Tags).victimTeamShortTag._M_dataplus._M_p;
  tag_78._M_len = (this->super_Tags).victimTeamShortTag._M_string_length;
  internal_tag_78._M_str = (this->super_Tags).INTERNAL_VICTIM_TEAM_SHORT_TAG._M_dataplus._M_p;
  internal_tag_78._M_len = (this->super_Tags).INTERNAL_VICTIM_TEAM_SHORT_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_78,internal_tag_78);
  tag_79._M_str = (this->super_Tags).victimTeamLongTag._M_dataplus._M_p;
  tag_79._M_len = (this->super_Tags).victimTeamLongTag._M_string_length;
  internal_tag_79._M_str = (this->super_Tags).INTERNAL_VICTIM_TEAM_LONG_TAG._M_dataplus._M_p;
  internal_tag_79._M_len = (this->super_Tags).INTERNAL_VICTIM_TEAM_LONG_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_79,internal_tag_79);
  tag_80._M_str = (this->super_Tags).victimPingTag._M_dataplus._M_p;
  tag_80._M_len = (this->super_Tags).victimPingTag._M_string_length;
  internal_tag_80._M_str = (this->super_Tags).INTERNAL_VICTIM_PING_TAG._M_dataplus._M_p;
  internal_tag_80._M_len = (this->super_Tags).INTERNAL_VICTIM_PING_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_80,internal_tag_80);
  tag_81._M_str = (this->super_Tags).victimScoreTag._M_dataplus._M_p;
  tag_81._M_len = (this->super_Tags).victimScoreTag._M_string_length;
  internal_tag_81._M_str = (this->super_Tags).INTERNAL_VICTIM_SCORE_TAG._M_dataplus._M_p;
  internal_tag_81._M_len = (this->super_Tags).INTERNAL_VICTIM_SCORE_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_81,internal_tag_81);
  tag_82._M_str = (this->super_Tags).victimScorePerMinuteTag._M_dataplus._M_p;
  tag_82._M_len = (this->super_Tags).victimScorePerMinuteTag._M_string_length;
  internal_tag_82._M_str = (this->super_Tags).INTERNAL_VICTIM_SCORE_PER_MINUTE_TAG._M_dataplus._M_p;
  internal_tag_82._M_len = (this->super_Tags).INTERNAL_VICTIM_SCORE_PER_MINUTE_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_82,internal_tag_82);
  tag_83._M_str = (this->super_Tags).victimCreditsTag._M_dataplus._M_p;
  tag_83._M_len = (this->super_Tags).victimCreditsTag._M_string_length;
  internal_tag_83._M_str = (this->super_Tags).INTERNAL_VICTIM_CREDITS_TAG._M_dataplus._M_p;
  internal_tag_83._M_len = (this->super_Tags).INTERNAL_VICTIM_CREDITS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_83,internal_tag_83);
  tag_84._M_str = (this->super_Tags).victimKillsTag._M_dataplus._M_p;
  tag_84._M_len = (this->super_Tags).victimKillsTag._M_string_length;
  internal_tag_84._M_str = (this->super_Tags).INTERNAL_VICTIM_KILLS_TAG._M_dataplus._M_p;
  internal_tag_84._M_len = (this->super_Tags).INTERNAL_VICTIM_KILLS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_84,internal_tag_84);
  tag_85._M_str = (this->super_Tags).victimDeathsTag._M_dataplus._M_p;
  tag_85._M_len = (this->super_Tags).victimDeathsTag._M_string_length;
  internal_tag_85._M_str = (this->super_Tags).INTERNAL_VICTIM_DEATHS_TAG._M_dataplus._M_p;
  internal_tag_85._M_len = (this->super_Tags).INTERNAL_VICTIM_DEATHS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_85,internal_tag_85);
  tag_86._M_str = (this->super_Tags).victimKDRTag._M_dataplus._M_p;
  tag_86._M_len = (this->super_Tags).victimKDRTag._M_string_length;
  internal_tag_86._M_str = (this->super_Tags).INTERNAL_VICTIM_KDR_TAG._M_dataplus._M_p;
  internal_tag_86._M_len = (this->super_Tags).INTERNAL_VICTIM_KDR_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_86,internal_tag_86);
  tag_87._M_str = (this->super_Tags).victimSuicidesTag._M_dataplus._M_p;
  tag_87._M_len = (this->super_Tags).victimSuicidesTag._M_string_length;
  internal_tag_87._M_str = (this->super_Tags).INTERNAL_VICTIM_SUICIDES_TAG._M_dataplus._M_p;
  internal_tag_87._M_len = (this->super_Tags).INTERNAL_VICTIM_SUICIDES_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_87,internal_tag_87);
  tag_88._M_str = (this->super_Tags).victimHeadshotsTag._M_dataplus._M_p;
  tag_88._M_len = (this->super_Tags).victimHeadshotsTag._M_string_length;
  internal_tag_88._M_str = (this->super_Tags).INTERNAL_VICTIM_HEADSHOTS_TAG._M_dataplus._M_p;
  internal_tag_88._M_len = (this->super_Tags).INTERNAL_VICTIM_HEADSHOTS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_88,internal_tag_88);
  tag_89._M_str = (this->super_Tags).victimHeadshotKillRatioTag._M_dataplus._M_p;
  tag_89._M_len = (this->super_Tags).victimHeadshotKillRatioTag._M_string_length;
  internal_tag_89._M_str =
       (this->super_Tags).INTERNAL_VICTIM_HEADSHOT_KILL_RATIO_TAG._M_dataplus._M_p;
  internal_tag_89._M_len =
       (this->super_Tags).INTERNAL_VICTIM_HEADSHOT_KILL_RATIO_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_89,internal_tag_89);
  tag_90._M_str = (this->super_Tags).victimVehicleKillsTag._M_dataplus._M_p;
  tag_90._M_len = (this->super_Tags).victimVehicleKillsTag._M_string_length;
  internal_tag_90._M_str = (this->super_Tags).INTERNAL_VICTIM_VEHICLE_KILLS_TAG._M_dataplus._M_p;
  internal_tag_90._M_len = (this->super_Tags).INTERNAL_VICTIM_VEHICLE_KILLS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_90,internal_tag_90);
  tag_91._M_str = (this->super_Tags).victimBuildingKillsTag._M_dataplus._M_p;
  tag_91._M_len = (this->super_Tags).victimBuildingKillsTag._M_string_length;
  internal_tag_91._M_str = (this->super_Tags).INTERNAL_VICTIM_BUILDING_KILLS_TAG._M_dataplus._M_p;
  internal_tag_91._M_len = (this->super_Tags).INTERNAL_VICTIM_BUILDING_KILLS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_91,internal_tag_91);
  tag_92._M_str = (this->super_Tags).victimDefenceKillsTag._M_dataplus._M_p;
  tag_92._M_len = (this->super_Tags).victimDefenceKillsTag._M_string_length;
  internal_tag_92._M_str = (this->super_Tags).INTERNAL_VICTIM_DEFENCE_KILLS_TAG._M_dataplus._M_p;
  internal_tag_92._M_len = (this->super_Tags).INTERNAL_VICTIM_DEFENCE_KILLS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_92,internal_tag_92);
  tag_93._M_str = (this->super_Tags).victimGameTimeTag._M_dataplus._M_p;
  tag_93._M_len = (this->super_Tags).victimGameTimeTag._M_string_length;
  internal_tag_93._M_str = (this->super_Tags).INTERNAL_VICTIM_GAME_TIME_TAG._M_dataplus._M_p;
  internal_tag_93._M_len = (this->super_Tags).INTERNAL_VICTIM_GAME_TIME_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_93,internal_tag_93);
  tag_94._M_str = (this->super_Tags).victimGamesTag._M_dataplus._M_p;
  tag_94._M_len = (this->super_Tags).victimGamesTag._M_string_length;
  internal_tag_94._M_str = (this->super_Tags).INTERNAL_VICTIM_GAMES_TAG._M_dataplus._M_p;
  internal_tag_94._M_len = (this->super_Tags).INTERNAL_VICTIM_GAMES_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_94,internal_tag_94);
  tag_95._M_str = (this->super_Tags).victimGDIGamesTag._M_dataplus._M_p;
  tag_95._M_len = (this->super_Tags).victimGDIGamesTag._M_string_length;
  internal_tag_95._M_str = (this->super_Tags).INTERNAL_VICTIM_GDI_GAMES_TAG._M_dataplus._M_p;
  internal_tag_95._M_len = (this->super_Tags).INTERNAL_VICTIM_GDI_GAMES_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_95,internal_tag_95);
  tag_96._M_str = (this->super_Tags).victimNodGamesTag._M_dataplus._M_p;
  tag_96._M_len = (this->super_Tags).victimNodGamesTag._M_string_length;
  internal_tag_96._M_str = (this->super_Tags).INTERNAL_VICTIM_NOD_GAMES_TAG._M_dataplus._M_p;
  internal_tag_96._M_len = (this->super_Tags).INTERNAL_VICTIM_NOD_GAMES_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_96,internal_tag_96);
  tag_97._M_str = (this->super_Tags).victimWinsTag._M_dataplus._M_p;
  tag_97._M_len = (this->super_Tags).victimWinsTag._M_string_length;
  internal_tag_97._M_str = (this->super_Tags).INTERNAL_VICTIM_WINS_TAG._M_dataplus._M_p;
  internal_tag_97._M_len = (this->super_Tags).INTERNAL_VICTIM_WINS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_97,internal_tag_97);
  tag_98._M_str = (this->super_Tags).victimGDIWinsTag._M_dataplus._M_p;
  tag_98._M_len = (this->super_Tags).victimGDIWinsTag._M_string_length;
  internal_tag_98._M_str = (this->super_Tags).INTERNAL_VICTIM_GDI_WINS_TAG._M_dataplus._M_p;
  internal_tag_98._M_len = (this->super_Tags).INTERNAL_VICTIM_GDI_WINS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_98,internal_tag_98);
  tag_99._M_str = (this->super_Tags).victimNodWinsTag._M_dataplus._M_p;
  tag_99._M_len = (this->super_Tags).victimNodWinsTag._M_string_length;
  internal_tag_99._M_str = (this->super_Tags).INTERNAL_VICTIM_NOD_WINS_TAG._M_dataplus._M_p;
  internal_tag_99._M_len = (this->super_Tags).INTERNAL_VICTIM_NOD_WINS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_99,internal_tag_99);
  tag_x00100._M_str = (this->super_Tags).victimTiesTag._M_dataplus._M_p;
  tag_x00100._M_len = (this->super_Tags).victimTiesTag._M_string_length;
  internal_tag_x00100._M_str = (this->super_Tags).INTERNAL_VICTIM_TIES_TAG._M_dataplus._M_p;
  internal_tag_x00100._M_len = (this->super_Tags).INTERNAL_VICTIM_TIES_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00100,internal_tag_x00100);
  tag_x00101._M_str = (this->super_Tags).victimLossesTag._M_dataplus._M_p;
  tag_x00101._M_len = (this->super_Tags).victimLossesTag._M_string_length;
  internal_tag_x00101._M_str = (this->super_Tags).INTERNAL_VICTIM_LOSSES_TAG._M_dataplus._M_p;
  internal_tag_x00101._M_len = (this->super_Tags).INTERNAL_VICTIM_LOSSES_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00101,internal_tag_x00101);
  tag_x00102._M_str = (this->super_Tags).victimGDILossesTag._M_dataplus._M_p;
  tag_x00102._M_len = (this->super_Tags).victimGDILossesTag._M_string_length;
  internal_tag_x00102._M_str = (this->super_Tags).INTERNAL_VICTIM_GDI_LOSSES_TAG._M_dataplus._M_p;
  internal_tag_x00102._M_len = (this->super_Tags).INTERNAL_VICTIM_GDI_LOSSES_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00102,internal_tag_x00102);
  tag_x00103._M_str = (this->super_Tags).victimNodLossesTag._M_dataplus._M_p;
  tag_x00103._M_len = (this->super_Tags).victimNodLossesTag._M_string_length;
  internal_tag_x00103._M_str = (this->super_Tags).INTERNAL_VICTIM_NOD_LOSSES_TAG._M_dataplus._M_p;
  internal_tag_x00103._M_len = (this->super_Tags).INTERNAL_VICTIM_NOD_LOSSES_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00103,internal_tag_x00103);
  tag_x00104._M_str = (this->super_Tags).victimWinLossRatioTag._M_dataplus._M_p;
  tag_x00104._M_len = (this->super_Tags).victimWinLossRatioTag._M_string_length;
  internal_tag_x00104._M_str =
       (this->super_Tags).INTERNAL_VICTIM_WIN_LOSS_RATIO_TAG._M_dataplus._M_p;
  internal_tag_x00104._M_len =
       (this->super_Tags).INTERNAL_VICTIM_WIN_LOSS_RATIO_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00104,internal_tag_x00104);
  tag_x00105._M_str = (this->super_Tags).victimGDIWinLossRatioTag._M_dataplus._M_p;
  tag_x00105._M_len = (this->super_Tags).victimGDIWinLossRatioTag._M_string_length;
  internal_tag_x00105._M_str =
       (this->super_Tags).INTERNAL_VICTIM_GDI_WIN_LOSS_RATIO_TAG._M_dataplus._M_p;
  internal_tag_x00105._M_len =
       (this->super_Tags).INTERNAL_VICTIM_GDI_WIN_LOSS_RATIO_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00105,internal_tag_x00105);
  tag_x00106._M_str = (this->super_Tags).victimNodWinLossRatioTag._M_dataplus._M_p;
  tag_x00106._M_len = (this->super_Tags).victimNodWinLossRatioTag._M_string_length;
  internal_tag_x00106._M_str =
       (this->super_Tags).INTERNAL_VICTIM_NOD_WIN_LOSS_RATIO_TAG._M_dataplus._M_p;
  internal_tag_x00106._M_len =
       (this->super_Tags).INTERNAL_VICTIM_NOD_WIN_LOSS_RATIO_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00106,internal_tag_x00106);
  tag_x00107._M_str = (this->super_Tags).victimBeaconPlacementsTag._M_dataplus._M_p;
  tag_x00107._M_len = (this->super_Tags).victimBeaconPlacementsTag._M_string_length;
  internal_tag_x00107._M_str =
       (this->super_Tags).INTERNAL_VICTIM_BEACON_PLACEMENTS_TAG._M_dataplus._M_p;
  internal_tag_x00107._M_len =
       (this->super_Tags).INTERNAL_VICTIM_BEACON_PLACEMENTS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00107,internal_tag_x00107);
  tag_x00108._M_str = (this->super_Tags).victimBeaconDisarmsTag._M_dataplus._M_p;
  tag_x00108._M_len = (this->super_Tags).victimBeaconDisarmsTag._M_string_length;
  internal_tag_x00108._M_str =
       (this->super_Tags).INTERNAL_VICTIM_BEACON_DISARMS_TAG._M_dataplus._M_p;
  internal_tag_x00108._M_len =
       (this->super_Tags).INTERNAL_VICTIM_BEACON_DISARMS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00108,internal_tag_x00108);
  tag_x00109._M_str = (this->super_Tags).victimProxyPlacementsTag._M_dataplus._M_p;
  tag_x00109._M_len = (this->super_Tags).victimProxyPlacementsTag._M_string_length;
  internal_tag_x00109._M_str =
       (this->super_Tags).INTERNAL_VICTIM_PROXY_PLACEMENTS_TAG._M_dataplus._M_p;
  internal_tag_x00109._M_len =
       (this->super_Tags).INTERNAL_VICTIM_PROXY_PLACEMENTS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00109,internal_tag_x00109);
  tag_x00110._M_str = (this->super_Tags).victimProxyDisarmsTag._M_dataplus._M_p;
  tag_x00110._M_len = (this->super_Tags).victimProxyDisarmsTag._M_string_length;
  internal_tag_x00110._M_str = (this->super_Tags).INTERNAL_VICTIM_PROXY_DISARMS_TAG._M_dataplus._M_p
  ;
  internal_tag_x00110._M_len = (this->super_Tags).INTERNAL_VICTIM_PROXY_DISARMS_TAG._M_string_length
  ;
  RenX::replace_tag(fmt,tag_x00110,internal_tag_x00110);
  tag_x00111._M_str = (this->super_Tags).victimCapturesTag._M_dataplus._M_p;
  tag_x00111._M_len = (this->super_Tags).victimCapturesTag._M_string_length;
  internal_tag_x00111._M_str = (this->super_Tags).INTERNAL_VICTIM_CAPTURES_TAG._M_dataplus._M_p;
  internal_tag_x00111._M_len = (this->super_Tags).INTERNAL_VICTIM_CAPTURES_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00111,internal_tag_x00111);
  tag_x00112._M_str = (this->super_Tags).victimStealsTag._M_dataplus._M_p;
  tag_x00112._M_len = (this->super_Tags).victimStealsTag._M_string_length;
  internal_tag_x00112._M_str = (this->super_Tags).INTERNAL_VICTIM_STEALS_TAG._M_dataplus._M_p;
  internal_tag_x00112._M_len = (this->super_Tags).INTERNAL_VICTIM_STEALS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00112,internal_tag_x00112);
  tag_x00113._M_str = (this->super_Tags).victimStolenTag._M_dataplus._M_p;
  tag_x00113._M_len = (this->super_Tags).victimStolenTag._M_string_length;
  internal_tag_x00113._M_str = (this->super_Tags).INTERNAL_VICTIM_STOLEN_TAG._M_dataplus._M_p;
  internal_tag_x00113._M_len = (this->super_Tags).INTERNAL_VICTIM_STOLEN_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00113,internal_tag_x00113);
  tag_x00114._M_str = (this->super_Tags).victimAccessTag._M_dataplus._M_p;
  tag_x00114._M_len = (this->super_Tags).victimAccessTag._M_string_length;
  internal_tag_x00114._M_str = (this->super_Tags).INTERNAL_VICTIM_ACCESS_TAG._M_dataplus._M_p;
  internal_tag_x00114._M_len = (this->super_Tags).INTERNAL_VICTIM_ACCESS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00114,internal_tag_x00114);
  tag_x00115._M_str = (this->super_Tags).buildingNameTag._M_dataplus._M_p;
  tag_x00115._M_len = (this->super_Tags).buildingNameTag._M_string_length;
  internal_tag_x00115._M_str = (this->super_Tags).INTERNAL_BUILDING_NAME_TAG._M_dataplus._M_p;
  internal_tag_x00115._M_len = (this->super_Tags).INTERNAL_BUILDING_NAME_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00115,internal_tag_x00115);
  tag_x00116._M_str = (this->super_Tags).buildingRawNameTag._M_dataplus._M_p;
  tag_x00116._M_len = (this->super_Tags).buildingRawNameTag._M_string_length;
  internal_tag_x00116._M_str = (this->super_Tags).INTERNAL_BUILDING_RAW_NAME_TAG._M_dataplus._M_p;
  internal_tag_x00116._M_len = (this->super_Tags).INTERNAL_BUILDING_RAW_NAME_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00116,internal_tag_x00116);
  tag_x00117._M_str = (this->super_Tags).buildingHealthTag._M_dataplus._M_p;
  tag_x00117._M_len = (this->super_Tags).buildingHealthTag._M_string_length;
  internal_tag_x00117._M_str = (this->super_Tags).INTERNAL_BUILDING_HEALTH_TAG._M_dataplus._M_p;
  internal_tag_x00117._M_len = (this->super_Tags).INTERNAL_BUILDING_HEALTH_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00117,internal_tag_x00117);
  tag_x00118._M_str = (this->super_Tags).buildingMaxHealthTag._M_dataplus._M_p;
  tag_x00118._M_len = (this->super_Tags).buildingMaxHealthTag._M_string_length;
  internal_tag_x00118._M_str = (this->super_Tags).INTERNAL_BUILDING_MAX_HEALTH_TAG._M_dataplus._M_p;
  internal_tag_x00118._M_len = (this->super_Tags).INTERNAL_BUILDING_MAX_HEALTH_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00118,internal_tag_x00118);
  tag_x00119._M_str = (this->super_Tags).buildingHealthPercentageTag._M_dataplus._M_p;
  tag_x00119._M_len = (this->super_Tags).buildingHealthPercentageTag._M_string_length;
  internal_tag_x00119._M_str =
       (this->super_Tags).INTERNAL_BUILDING_HEALTH_PERCENTAGE_TAG._M_dataplus._M_p;
  internal_tag_x00119._M_len =
       (this->super_Tags).INTERNAL_BUILDING_HEALTH_PERCENTAGE_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00119,internal_tag_x00119);
  tag_x00120._M_str = (this->super_Tags).buildingArmorTag._M_dataplus._M_p;
  tag_x00120._M_len = (this->super_Tags).buildingArmorTag._M_string_length;
  internal_tag_x00120._M_str = (this->super_Tags).INTERNAL_BUILDING_ARMOR_TAG._M_dataplus._M_p;
  internal_tag_x00120._M_len = (this->super_Tags).INTERNAL_BUILDING_ARMOR_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00120,internal_tag_x00120);
  tag_x00121._M_str = (this->super_Tags).buildingMaxArmorTag._M_dataplus._M_p;
  tag_x00121._M_len = (this->super_Tags).buildingMaxArmorTag._M_string_length;
  internal_tag_x00121._M_str = (this->super_Tags).INTERNAL_BUILDING_MAX_ARMOR_TAG._M_dataplus._M_p;
  internal_tag_x00121._M_len = (this->super_Tags).INTERNAL_BUILDING_MAX_ARMOR_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00121,internal_tag_x00121);
  tag_x00122._M_str = (this->super_Tags).buildingArmorPercentageTag._M_dataplus._M_p;
  tag_x00122._M_len = (this->super_Tags).buildingArmorPercentageTag._M_string_length;
  internal_tag_x00122._M_str =
       (this->super_Tags).INTERNAL_BUILDING_ARMOR_PERCENTAGE_TAG._M_dataplus._M_p;
  internal_tag_x00122._M_len =
       (this->super_Tags).INTERNAL_BUILDING_ARMOR_PERCENTAGE_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00122,internal_tag_x00122);
  tag_x00123._M_str = (this->super_Tags).buildingDurabilityTag._M_dataplus._M_p;
  tag_x00123._M_len = (this->super_Tags).buildingDurabilityTag._M_string_length;
  internal_tag_x00123._M_str = (this->super_Tags).INTERNAL_BUILDING_DURABILITY_TAG._M_dataplus._M_p;
  internal_tag_x00123._M_len = (this->super_Tags).INTERNAL_BUILDING_DURABILITY_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00123,internal_tag_x00123);
  tag_x00124._M_str = (this->super_Tags).buildingMaxDurabilityTag._M_dataplus._M_p;
  tag_x00124._M_len = (this->super_Tags).buildingMaxDurabilityTag._M_string_length;
  internal_tag_x00124._M_str =
       (this->super_Tags).INTERNAL_BUILDING_MAX_DURABILITY_TAG._M_dataplus._M_p;
  internal_tag_x00124._M_len =
       (this->super_Tags).INTERNAL_BUILDING_MAX_DURABILITY_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00124,internal_tag_x00124);
  tag_x00125._M_str = (this->super_Tags).buildingDurabilityPercentageTag._M_dataplus._M_p;
  tag_x00125._M_len = (this->super_Tags).buildingDurabilityPercentageTag._M_string_length;
  internal_tag_x00125._M_str =
       (this->super_Tags).INTERNAL_BUILDING_DURABILITY_PERCENTAGE_TAG._M_dataplus._M_p;
  internal_tag_x00125._M_len =
       (this->super_Tags).INTERNAL_BUILDING_DURABILITY_PERCENTAGE_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00125,internal_tag_x00125);
  tag_x00126._M_str = (this->super_Tags).buildingTeamColorTag._M_dataplus._M_p;
  tag_x00126._M_len = (this->super_Tags).buildingTeamColorTag._M_string_length;
  internal_tag_x00126._M_str = (this->super_Tags).INTERNAL_BUILDING_TEAM_COLOR_TAG._M_dataplus._M_p;
  internal_tag_x00126._M_len = (this->super_Tags).INTERNAL_BUILDING_TEAM_COLOR_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00126,internal_tag_x00126);
  tag_x00127._M_str = (this->super_Tags).buildingTeamShortTag._M_dataplus._M_p;
  tag_x00127._M_len = (this->super_Tags).buildingTeamShortTag._M_string_length;
  internal_tag_x00127._M_str = (this->super_Tags).INTERNAL_BUILDING_TEAM_SHORT_TAG._M_dataplus._M_p;
  internal_tag_x00127._M_len = (this->super_Tags).INTERNAL_BUILDING_TEAM_SHORT_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00127,internal_tag_x00127);
  tag_x00128._M_str = (this->super_Tags).buildingTeamLongTag._M_dataplus._M_p;
  tag_x00128._M_len = (this->super_Tags).buildingTeamLongTag._M_string_length;
  internal_tag_x00128._M_str = (this->super_Tags).INTERNAL_BUILDING_TEAM_LONG_TAG._M_dataplus._M_p;
  internal_tag_x00128._M_len = (this->super_Tags).INTERNAL_BUILDING_TEAM_LONG_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00128,internal_tag_x00128);
  tag_x00129._M_str = (this->super_Tags).rankTag._M_dataplus._M_p;
  tag_x00129._M_len = (this->super_Tags).rankTag._M_string_length;
  internal_tag_x00129._M_str = (this->super_Tags).INTERNAL_RANK_TAG._M_dataplus._M_p;
  internal_tag_x00129._M_len = (this->super_Tags).INTERNAL_RANK_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00129,internal_tag_x00129);
  tag_x00130._M_str = (this->super_Tags).lastGameTag._M_dataplus._M_p;
  tag_x00130._M_len = (this->super_Tags).lastGameTag._M_string_length;
  internal_tag_x00130._M_str = (this->super_Tags).INTERNAL_LAST_GAME_TAG._M_dataplus._M_p;
  internal_tag_x00130._M_len = (this->super_Tags).INTERNAL_LAST_GAME_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00130,internal_tag_x00130);
  tag_x00131._M_str = (this->super_Tags).GDIScoreTag._M_dataplus._M_p;
  tag_x00131._M_len = (this->super_Tags).GDIScoreTag._M_string_length;
  internal_tag_x00131._M_str = (this->super_Tags).INTERNAL_GDI_SCORE_TAG._M_dataplus._M_p;
  internal_tag_x00131._M_len = (this->super_Tags).INTERNAL_GDI_SCORE_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00131,internal_tag_x00131);
  tag_x00132._M_str = (this->super_Tags).GDISPMTag._M_dataplus._M_p;
  tag_x00132._M_len = (this->super_Tags).GDISPMTag._M_string_length;
  internal_tag_x00132._M_str = (this->super_Tags).INTERNAL_GDI_SPM_TAG._M_dataplus._M_p;
  internal_tag_x00132._M_len = (this->super_Tags).INTERNAL_GDI_SPM_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00132,internal_tag_x00132);
  tag_x00133._M_str = (this->super_Tags).GDIGameTimeTag._M_dataplus._M_p;
  tag_x00133._M_len = (this->super_Tags).GDIGameTimeTag._M_string_length;
  internal_tag_x00133._M_str = (this->super_Tags).INTERNAL_GDI_GAME_TIME_TAG._M_dataplus._M_p;
  internal_tag_x00133._M_len = (this->super_Tags).INTERNAL_GDI_GAME_TIME_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00133,internal_tag_x00133);
  tag_x00134._M_str = (this->super_Tags).GDITiesTag._M_dataplus._M_p;
  tag_x00134._M_len = (this->super_Tags).GDITiesTag._M_string_length;
  internal_tag_x00134._M_str = (this->super_Tags).INTERNAL_GDI_TIES_TAG._M_dataplus._M_p;
  internal_tag_x00134._M_len = (this->super_Tags).INTERNAL_GDI_TIES_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00134,internal_tag_x00134);
  tag_x00135._M_str = (this->super_Tags).GDIBeaconPlacementsTag._M_dataplus._M_p;
  tag_x00135._M_len = (this->super_Tags).GDIBeaconPlacementsTag._M_string_length;
  internal_tag_x00135._M_str =
       (this->super_Tags).INTERNAL_GDI_BEACON_PLACEMENTS_TAG._M_dataplus._M_p;
  internal_tag_x00135._M_len =
       (this->super_Tags).INTERNAL_GDI_BEACON_PLACEMENTS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00135,internal_tag_x00135);
  tag_x00136._M_str = (this->super_Tags).GDIBeaconDisarmsTag._M_dataplus._M_p;
  tag_x00136._M_len = (this->super_Tags).GDIBeaconDisarmsTag._M_string_length;
  internal_tag_x00136._M_str = (this->super_Tags).INTERNAL_GDI_BEACON_DISARMS_TAG._M_dataplus._M_p;
  internal_tag_x00136._M_len = (this->super_Tags).INTERNAL_GDI_BEACON_DISARMS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00136,internal_tag_x00136);
  tag_x00137._M_str = (this->super_Tags).GDIProxyPlacementsTag._M_dataplus._M_p;
  tag_x00137._M_len = (this->super_Tags).GDIProxyPlacementsTag._M_string_length;
  internal_tag_x00137._M_str = (this->super_Tags).INTERNAL_GDI_PROXY_PLACEMENTS_TAG._M_dataplus._M_p
  ;
  internal_tag_x00137._M_len = (this->super_Tags).INTERNAL_GDI_PROXY_PLACEMENTS_TAG._M_string_length
  ;
  RenX::replace_tag(fmt,tag_x00137,internal_tag_x00137);
  tag_x00138._M_str = (this->super_Tags).GDIProxyDisarmsTag._M_dataplus._M_p;
  tag_x00138._M_len = (this->super_Tags).GDIProxyDisarmsTag._M_string_length;
  internal_tag_x00138._M_str = (this->super_Tags).INTERNAL_GDI_PROXY_DISARMS_TAG._M_dataplus._M_p;
  internal_tag_x00138._M_len = (this->super_Tags).INTERNAL_GDI_PROXY_DISARMS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00138,internal_tag_x00138);
  tag_x00139._M_str = (this->super_Tags).GDIKillsTag._M_dataplus._M_p;
  tag_x00139._M_len = (this->super_Tags).GDIKillsTag._M_string_length;
  internal_tag_x00139._M_str = (this->super_Tags).INTERNAL_GDI_KILLS_TAG._M_dataplus._M_p;
  internal_tag_x00139._M_len = (this->super_Tags).INTERNAL_GDI_KILLS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00139,internal_tag_x00139);
  tag_x00140._M_str = (this->super_Tags).GDIDeathsTag._M_dataplus._M_p;
  tag_x00140._M_len = (this->super_Tags).GDIDeathsTag._M_string_length;
  internal_tag_x00140._M_str = (this->super_Tags).INTERNAL_GDI_DEATHS_TAG._M_dataplus._M_p;
  internal_tag_x00140._M_len = (this->super_Tags).INTERNAL_GDI_DEATHS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00140,internal_tag_x00140);
  tag_x00141._M_str = (this->super_Tags).GDIVehicleKillsTag._M_dataplus._M_p;
  tag_x00141._M_len = (this->super_Tags).GDIVehicleKillsTag._M_string_length;
  internal_tag_x00141._M_str = (this->super_Tags).INTERNAL_GDI_VEHICLE_KILLS_TAG._M_dataplus._M_p;
  internal_tag_x00141._M_len = (this->super_Tags).INTERNAL_GDI_VEHICLE_KILLS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00141,internal_tag_x00141);
  tag_x00142._M_str = (this->super_Tags).GDIDefenceKillsTag._M_dataplus._M_p;
  tag_x00142._M_len = (this->super_Tags).GDIDefenceKillsTag._M_string_length;
  internal_tag_x00142._M_str = (this->super_Tags).INTERNAL_GDI_DEFENCE_KILLS_TAG._M_dataplus._M_p;
  internal_tag_x00142._M_len = (this->super_Tags).INTERNAL_GDI_DEFENCE_KILLS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00142,internal_tag_x00142);
  tag_x00143._M_str = (this->super_Tags).GDIBuildingKillsTag._M_dataplus._M_p;
  tag_x00143._M_len = (this->super_Tags).GDIBuildingKillsTag._M_string_length;
  internal_tag_x00143._M_str = (this->super_Tags).INTERNAL_GDI_BUILDING_KILLS_TAG._M_dataplus._M_p;
  internal_tag_x00143._M_len = (this->super_Tags).INTERNAL_GDI_BUILDING_KILLS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00143,internal_tag_x00143);
  tag_x00144._M_str = (this->super_Tags).GDIKDRTag._M_dataplus._M_p;
  tag_x00144._M_len = (this->super_Tags).GDIKDRTag._M_string_length;
  internal_tag_x00144._M_str = (this->super_Tags).INTERNAL_GDI_KDR_TAG._M_dataplus._M_p;
  internal_tag_x00144._M_len = (this->super_Tags).INTERNAL_GDI_KDR_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00144,internal_tag_x00144);
  tag_x00145._M_str = (this->super_Tags).GDIHeadshotsTag._M_dataplus._M_p;
  tag_x00145._M_len = (this->super_Tags).GDIHeadshotsTag._M_string_length;
  internal_tag_x00145._M_str = (this->super_Tags).INTERNAL_GDI_HEADSHOTS_TAG._M_dataplus._M_p;
  internal_tag_x00145._M_len = (this->super_Tags).INTERNAL_GDI_HEADSHOTS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00145,internal_tag_x00145);
  tag_x00146._M_str = (this->super_Tags).GDIHeadshotKillRatioTag._M_dataplus._M_p;
  tag_x00146._M_len = (this->super_Tags).GDIHeadshotKillRatioTag._M_string_length;
  internal_tag_x00146._M_str =
       (this->super_Tags).INTERNAL_GDI_HEADSHOT_KILL_RATIO_TAG._M_dataplus._M_p;
  internal_tag_x00146._M_len =
       (this->super_Tags).INTERNAL_GDI_HEADSHOT_KILL_RATIO_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00146,internal_tag_x00146);
  tag_x00147._M_str = (this->super_Tags).NodScoreTag._M_dataplus._M_p;
  tag_x00147._M_len = (this->super_Tags).NodScoreTag._M_string_length;
  internal_tag_x00147._M_str = (this->super_Tags).INTERNAL_NOD_SCORE_TAG._M_dataplus._M_p;
  internal_tag_x00147._M_len = (this->super_Tags).INTERNAL_NOD_SCORE_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00147,internal_tag_x00147);
  tag_x00148._M_str = (this->super_Tags).NodSPMTag._M_dataplus._M_p;
  tag_x00148._M_len = (this->super_Tags).NodSPMTag._M_string_length;
  internal_tag_x00148._M_str = (this->super_Tags).INTERNAL_NOD_SPM_TAG._M_dataplus._M_p;
  internal_tag_x00148._M_len = (this->super_Tags).INTERNAL_NOD_SPM_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00148,internal_tag_x00148);
  tag_x00149._M_str = (this->super_Tags).NodGameTimeTag._M_dataplus._M_p;
  tag_x00149._M_len = (this->super_Tags).NodGameTimeTag._M_string_length;
  internal_tag_x00149._M_str = (this->super_Tags).INTERNAL_NOD_GAME_TIME_TAG._M_dataplus._M_p;
  internal_tag_x00149._M_len = (this->super_Tags).INTERNAL_NOD_GAME_TIME_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00149,internal_tag_x00149);
  tag_x00150._M_str = (this->super_Tags).NodTiesTag._M_dataplus._M_p;
  tag_x00150._M_len = (this->super_Tags).NodTiesTag._M_string_length;
  internal_tag_x00150._M_str = (this->super_Tags).INTERNAL_NOD_TIES_TAG._M_dataplus._M_p;
  internal_tag_x00150._M_len = (this->super_Tags).INTERNAL_NOD_TIES_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00150,internal_tag_x00150);
  tag_x00151._M_str = (this->super_Tags).NodBeaconPlacementsTag._M_dataplus._M_p;
  tag_x00151._M_len = (this->super_Tags).NodBeaconPlacementsTag._M_string_length;
  internal_tag_x00151._M_str =
       (this->super_Tags).INTERNAL_NOD_BEACON_PLACEMENTS_TAG._M_dataplus._M_p;
  internal_tag_x00151._M_len =
       (this->super_Tags).INTERNAL_NOD_BEACON_PLACEMENTS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00151,internal_tag_x00151);
  tag_x00152._M_str = (this->super_Tags).NodBeaconDisarmsTag._M_dataplus._M_p;
  tag_x00152._M_len = (this->super_Tags).NodBeaconDisarmsTag._M_string_length;
  internal_tag_x00152._M_str = (this->super_Tags).INTERNAL_NOD_BEACON_DISARMS_TAG._M_dataplus._M_p;
  internal_tag_x00152._M_len = (this->super_Tags).INTERNAL_NOD_BEACON_DISARMS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00152,internal_tag_x00152);
  tag_x00153._M_str = (this->super_Tags).NodProxyPlacementsTag._M_dataplus._M_p;
  tag_x00153._M_len = (this->super_Tags).NodProxyPlacementsTag._M_string_length;
  internal_tag_x00153._M_str = (this->super_Tags).INTERNAL_NOD_PROXY_PLACEMENTS_TAG._M_dataplus._M_p
  ;
  internal_tag_x00153._M_len = (this->super_Tags).INTERNAL_NOD_PROXY_PLACEMENTS_TAG._M_string_length
  ;
  RenX::replace_tag(fmt,tag_x00153,internal_tag_x00153);
  tag_x00154._M_str = (this->super_Tags).NodProxyDisarmsTag._M_dataplus._M_p;
  tag_x00154._M_len = (this->super_Tags).NodProxyDisarmsTag._M_string_length;
  internal_tag_x00154._M_str = (this->super_Tags).INTERNAL_NOD_PROXY_DISARMS_TAG._M_dataplus._M_p;
  internal_tag_x00154._M_len = (this->super_Tags).INTERNAL_NOD_PROXY_DISARMS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00154,internal_tag_x00154);
  tag_x00155._M_str = (this->super_Tags).NodKillsTag._M_dataplus._M_p;
  tag_x00155._M_len = (this->super_Tags).NodKillsTag._M_string_length;
  internal_tag_x00155._M_str = (this->super_Tags).INTERNAL_NOD_KILLS_TAG._M_dataplus._M_p;
  internal_tag_x00155._M_len = (this->super_Tags).INTERNAL_NOD_KILLS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00155,internal_tag_x00155);
  tag_x00156._M_str = (this->super_Tags).NodDeathsTag._M_dataplus._M_p;
  tag_x00156._M_len = (this->super_Tags).NodDeathsTag._M_string_length;
  internal_tag_x00156._M_str = (this->super_Tags).INTERNAL_NOD_DEATHS_TAG._M_dataplus._M_p;
  internal_tag_x00156._M_len = (this->super_Tags).INTERNAL_NOD_DEATHS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00156,internal_tag_x00156);
  tag_x00157._M_str = (this->super_Tags).NodVehicleKillsTag._M_dataplus._M_p;
  tag_x00157._M_len = (this->super_Tags).NodVehicleKillsTag._M_string_length;
  internal_tag_x00157._M_str = (this->super_Tags).INTERNAL_NOD_VEHICLE_KILLS_TAG._M_dataplus._M_p;
  internal_tag_x00157._M_len = (this->super_Tags).INTERNAL_NOD_VEHICLE_KILLS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00157,internal_tag_x00157);
  tag_x00158._M_str = (this->super_Tags).NodDefenceKillsTag._M_dataplus._M_p;
  tag_x00158._M_len = (this->super_Tags).NodDefenceKillsTag._M_string_length;
  internal_tag_x00158._M_str = (this->super_Tags).INTERNAL_NOD_DEFENCE_KILLS_TAG._M_dataplus._M_p;
  internal_tag_x00158._M_len = (this->super_Tags).INTERNAL_NOD_DEFENCE_KILLS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00158,internal_tag_x00158);
  tag_x00159._M_str = (this->super_Tags).NodBuildingKillsTag._M_dataplus._M_p;
  tag_x00159._M_len = (this->super_Tags).NodBuildingKillsTag._M_string_length;
  internal_tag_x00159._M_str = (this->super_Tags).INTERNAL_NOD_BUILDING_KILLS_TAG._M_dataplus._M_p;
  internal_tag_x00159._M_len = (this->super_Tags).INTERNAL_NOD_BUILDING_KILLS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00159,internal_tag_x00159);
  tag_x00160._M_str = (this->super_Tags).NodKDRTag._M_dataplus._M_p;
  tag_x00160._M_len = (this->super_Tags).NodKDRTag._M_string_length;
  internal_tag_x00160._M_str = (this->super_Tags).INTERNAL_NOD_KDR_TAG._M_dataplus._M_p;
  internal_tag_x00160._M_len = (this->super_Tags).INTERNAL_NOD_KDR_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00160,internal_tag_x00160);
  tag_x00161._M_str = (this->super_Tags).NodHeadshotsTag._M_dataplus._M_p;
  tag_x00161._M_len = (this->super_Tags).NodHeadshotsTag._M_string_length;
  internal_tag_x00161._M_str = (this->super_Tags).INTERNAL_NOD_HEADSHOTS_TAG._M_dataplus._M_p;
  internal_tag_x00161._M_len = (this->super_Tags).INTERNAL_NOD_HEADSHOTS_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00161,internal_tag_x00161);
  tag_x00162._M_str = (this->super_Tags).NodHeadshotKillRatioTag._M_dataplus._M_p;
  tag_x00162._M_len = (this->super_Tags).NodHeadshotKillRatioTag._M_string_length;
  internal_tag_x00162._M_str =
       (this->super_Tags).INTERNAL_NOD_HEADSHOT_KILL_RATIO_TAG._M_dataplus._M_p;
  internal_tag_x00162._M_len =
       (this->super_Tags).INTERNAL_NOD_HEADSHOT_KILL_RATIO_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00162,internal_tag_x00162);
  tag_x00163._M_str = (this->super_Tags).weaponTag._M_dataplus._M_p;
  tag_x00163._M_len = (this->super_Tags).weaponTag._M_string_length;
  internal_tag_x00163._M_str = (this->super_Tags).INTERNAL_WEAPON_TAG._M_dataplus._M_p;
  internal_tag_x00163._M_len = (this->super_Tags).INTERNAL_WEAPON_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00163,internal_tag_x00163);
  tag_x00164._M_str = (this->super_Tags).objectTag._M_dataplus._M_p;
  tag_x00164._M_len = (this->super_Tags).objectTag._M_string_length;
  internal_tag_x00164._M_str = (this->super_Tags).INTERNAL_OBJECT_TAG._M_dataplus._M_p;
  internal_tag_x00164._M_len = (this->super_Tags).INTERNAL_OBJECT_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00164,internal_tag_x00164);
  tag_x00165._M_str = (this->super_Tags).messageTag._M_dataplus._M_p;
  tag_x00165._M_len = (this->super_Tags).messageTag._M_string_length;
  internal_tag_x00165._M_str = (this->super_Tags).INTERNAL_MESSAGE_TAG._M_dataplus._M_p;
  internal_tag_x00165._M_len = (this->super_Tags).INTERNAL_MESSAGE_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00165,internal_tag_x00165);
  tag_x00166._M_str = (this->super_Tags).newNameTag._M_dataplus._M_p;
  tag_x00166._M_len = (this->super_Tags).newNameTag._M_string_length;
  internal_tag_x00166._M_str = (this->super_Tags).INTERNAL_NEW_NAME_TAG._M_dataplus._M_p;
  internal_tag_x00166._M_len = (this->super_Tags).INTERNAL_NEW_NAME_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00166,internal_tag_x00166);
  tag_x00167._M_str = (this->super_Tags).winScoreTag._M_dataplus._M_p;
  tag_x00167._M_len = (this->super_Tags).winScoreTag._M_string_length;
  internal_tag_x00167._M_str = (this->super_Tags).INTERNAL_WIN_SCORE_TAG._M_dataplus._M_p;
  internal_tag_x00167._M_len = (this->super_Tags).INTERNAL_WIN_SCORE_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00167,internal_tag_x00167);
  tag_x00168._M_str = (this->super_Tags).loseScoreTag._M_dataplus._M_p;
  tag_x00168._M_len = (this->super_Tags).loseScoreTag._M_string_length;
  internal_tag_x00168._M_str = (this->super_Tags).INTERNAL_LOSE_SCORE_TAG._M_dataplus._M_p;
  internal_tag_x00168._M_len = (this->super_Tags).INTERNAL_LOSE_SCORE_TAG._M_string_length;
  RenX::replace_tag(fmt,tag_x00168,internal_tag_x00168);
  this_00 = RenX::getCore();
  pvVar2 = RenX::Core::getPlugins(this_00);
  ppPVar1 = (pvVar2->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppPVar3 = (pvVar2->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppPVar3 != ppPVar1; ppPVar3 = ppPVar3 + 1
      ) {
    (**(code **)(*(long *)*ppPVar3 + 0xe0))(*ppPVar3,fmt);
  }
  return;
}

Assistant:

void TagsImp::sanitizeTags(std::string& fmt)
{
	/** Global tags */
	RenX::replace_tag(fmt, this->dateTag, this->INTERNAL_DATE_TAG);
	RenX::replace_tag(fmt, this->timeTag, this->INTERNAL_TIME_TAG);

	/** Server tags */
	RenX::replace_tag(fmt, this->rconVersionTag, this->INTERNAL_RCON_VERSION_TAG);
	RenX::replace_tag(fmt, this->gameVersionTag, this->INTERNAL_GAME_VERSION_TAG);
	RenX::replace_tag(fmt, this->rulesTag, this->INTERNAL_RULES_TAG);
	RenX::replace_tag(fmt, this->userTag, this->INTERNAL_USER_TAG);
	RenX::replace_tag(fmt, this->serverNameTag, this->INTERNAL_SERVER_NAME_TAG);
	RenX::replace_tag(fmt, this->mapTag, this->INTERNAL_MAP_TAG);
	RenX::replace_tag(fmt, this->mapGUIDTag, this->INTERNAL_MAP_GUID_TAG);
	RenX::replace_tag(fmt, this->serverHostnameTag, this->INTERNAL_SERVER_HOSTNAME_TAG);
	RenX::replace_tag(fmt, this->serverPortTag, this->INTERNAL_SERVER_PORT_TAG);
	RenX::replace_tag(fmt, this->socketHostnameTag, this->INTERNAL_SOCKET_HOSTNAME_TAG);
	RenX::replace_tag(fmt, this->socketPortTag, this->INTERNAL_SOCKET_PORT_TAG);
	RenX::replace_tag(fmt, this->serverPrefixTag, this->INTERNAL_SERVER_PREFIX_TAG);

	/** Player tags */
	RenX::replace_tag(fmt, this->nameTag, this->INTERNAL_NAME_TAG);
	RenX::replace_tag(fmt, this->rawNameTag, this->INTERNAL_RAW_NAME_TAG);
	RenX::replace_tag(fmt, this->ipTag, this->INTERNAL_IP_TAG);
	RenX::replace_tag(fmt, this->hwidTag, this->INTERNAL_HWID_TAG);
	RenX::replace_tag(fmt, this->rdnsTag, this->INTERNAL_RDNS_TAG);
	RenX::replace_tag(fmt, this->steamTag, this->INTERNAL_STEAM_TAG);
	RenX::replace_tag(fmt, this->uuidTag, this->INTERNAL_UUID_TAG);
	RenX::replace_tag(fmt, this->idTag, this->INTERNAL_ID_TAG);
	RenX::replace_tag(fmt, this->characterTag, this->INTERNAL_CHARACTER_TAG);
	RenX::replace_tag(fmt, this->vehicleTag, this->INTERNAL_VEHICLE_TAG);
	RenX::replace_tag(fmt, this->adminTag, this->INTERNAL_ADMIN_TAG);
	RenX::replace_tag(fmt, this->prefixTag, this->INTERNAL_PREFIX_TAG);
	RenX::replace_tag(fmt, this->gamePrefixTag, this->INTERNAL_GAME_PREFIX_TAG);
	RenX::replace_tag(fmt, this->teamColorTag, this->INTERNAL_TEAM_COLOR_TAG);
	RenX::replace_tag(fmt, this->teamShortTag, this->INTERNAL_TEAM_SHORT_TAG);
	RenX::replace_tag(fmt, this->teamLongTag, this->INTERNAL_TEAM_LONG_TAG);
	RenX::replace_tag(fmt, this->pingTag, this->INTERNAL_PING_TAG);
	RenX::replace_tag(fmt, this->scoreTag, this->INTERNAL_SCORE_TAG);
	RenX::replace_tag(fmt, this->scorePerMinuteTag, this->INTERNAL_SCORE_PER_MINUTE_TAG);
	RenX::replace_tag(fmt, this->creditsTag, this->INTERNAL_CREDITS_TAG);
	RenX::replace_tag(fmt, this->killsTag, this->INTERNAL_KILLS_TAG);
	RenX::replace_tag(fmt, this->deathsTag, this->INTERNAL_DEATHS_TAG);
	RenX::replace_tag(fmt, this->kdrTag, this->INTERNAL_KDR_TAG);
	RenX::replace_tag(fmt, this->suicidesTag, this->INTERNAL_SUICIDES_TAG);
	RenX::replace_tag(fmt, this->headshotsTag, this->INTERNAL_HEADSHOTS_TAG);
	RenX::replace_tag(fmt, this->headshotKillRatioTag, this->INTERNAL_HEADSHOT_KILL_RATIO_TAG);
	RenX::replace_tag(fmt, this->vehicleKillsTag, this->INTERNAL_VEHICLE_KILLS_TAG);
	RenX::replace_tag(fmt, this->buildingKillsTag, this->INTERNAL_BUILDING_KILLS_TAG);
	RenX::replace_tag(fmt, this->defenceKillsTag, this->INTERNAL_DEFENCE_KILLS_TAG);
	RenX::replace_tag(fmt, this->gameTimeTag, this->INTERNAL_GAME_TIME_TAG);
	RenX::replace_tag(fmt, this->gamesTag, this->INTERNAL_GAMES_TAG);
	RenX::replace_tag(fmt, this->GDIGamesTag, this->INTERNAL_GDI_GAMES_TAG);
	RenX::replace_tag(fmt, this->NodGamesTag, this->INTERNAL_NOD_GAMES_TAG);
	RenX::replace_tag(fmt, this->winsTag, this->INTERNAL_WINS_TAG);
	RenX::replace_tag(fmt, this->GDIWinsTag, this->INTERNAL_GDI_WINS_TAG);
	RenX::replace_tag(fmt, this->NodWinsTag, this->INTERNAL_NOD_WINS_TAG);
	RenX::replace_tag(fmt, this->tiesTag, this->INTERNAL_TIES_TAG);
	RenX::replace_tag(fmt, this->lossesTag, this->INTERNAL_LOSSES_TAG);
	RenX::replace_tag(fmt, this->GDILossesTag, this->INTERNAL_GDI_LOSSES_TAG);
	RenX::replace_tag(fmt, this->NodLossesTag, this->INTERNAL_NOD_LOSSES_TAG);
	RenX::replace_tag(fmt, this->winLossRatioTag, this->INTERNAL_WIN_LOSS_RATIO_TAG);
	RenX::replace_tag(fmt, this->GDIWinLossRatioTag, this->INTERNAL_GDI_WIN_LOSS_RATIO_TAG);
	RenX::replace_tag(fmt, this->NodWinLossRatioTag, this->INTERNAL_NOD_WIN_LOSS_RATIO_TAG);
	RenX::replace_tag(fmt, this->beaconPlacementsTag, this->INTERNAL_BEACON_PLACEMENTS_TAG);
	RenX::replace_tag(fmt, this->beaconDisarmsTag, this->INTERNAL_BEACON_DISARMS_TAG);
	RenX::replace_tag(fmt, this->proxyPlacementsTag, this->INTERNAL_PROXY_PLACEMENTS_TAG);
	RenX::replace_tag(fmt, this->proxyDisarmsTag, this->INTERNAL_PROXY_DISARMS_TAG);
	RenX::replace_tag(fmt, this->capturesTag, this->INTERNAL_CAPTURES_TAG);
	RenX::replace_tag(fmt, this->stealsTag, this->INTERNAL_STEALS_TAG);
	RenX::replace_tag(fmt, this->stolenTag, this->INTERNAL_STOLEN_TAG);
	RenX::replace_tag(fmt, this->accessTag, this->INTERNAL_ACCESS_TAG);

	/** Victim tags */
	RenX::replace_tag(fmt, this->victimNameTag, this->INTERNAL_VICTIM_NAME_TAG);
	RenX::replace_tag(fmt, this->victimRawNameTag, this->INTERNAL_VICTIM_RAW_NAME_TAG);
	RenX::replace_tag(fmt, this->victimIPTag, this->INTERNAL_VICTIM_IP_TAG);
	RenX::replace_tag(fmt, this->victimHWIDTag, this->INTERNAL_VICTIM_HWID_TAG);
	RenX::replace_tag(fmt, this->victimRDNSTag, this->INTERNAL_VICTIM_RDNS_TAG);
	RenX::replace_tag(fmt, this->victimSteamTag, this->INTERNAL_VICTIM_STEAM_TAG);
	RenX::replace_tag(fmt, this->victimUUIDTag, this->INTERNAL_VICTIM_UUID_TAG);
	RenX::replace_tag(fmt, this->victimIDTag, this->INTERNAL_VICTIM_ID_TAG);
	RenX::replace_tag(fmt, this->victimCharacterTag, this->INTERNAL_VICTIM_CHARACTER_TAG);
	RenX::replace_tag(fmt, this->victimVehicleTag, this->INTERNAL_VICTIM_VEHICLE_TAG);
	RenX::replace_tag(fmt, this->victimAdminTag, this->INTERNAL_VICTIM_ADMIN_TAG);
	RenX::replace_tag(fmt, this->victimPrefixTag, this->INTERNAL_VICTIM_PREFIX_TAG);
	RenX::replace_tag(fmt, this->victimGamePrefixTag, this->INTERNAL_VICTIM_GAME_PREFIX_TAG);
	RenX::replace_tag(fmt, this->victimTeamColorTag, this->INTERNAL_VICTIM_TEAM_COLOR_TAG);
	RenX::replace_tag(fmt, this->victimTeamShortTag, this->INTERNAL_VICTIM_TEAM_SHORT_TAG);
	RenX::replace_tag(fmt, this->victimTeamLongTag, this->INTERNAL_VICTIM_TEAM_LONG_TAG);
	RenX::replace_tag(fmt, this->victimPingTag, this->INTERNAL_VICTIM_PING_TAG);
	RenX::replace_tag(fmt, this->victimScoreTag, this->INTERNAL_VICTIM_SCORE_TAG);
	RenX::replace_tag(fmt, this->victimScorePerMinuteTag, this->INTERNAL_VICTIM_SCORE_PER_MINUTE_TAG);
	RenX::replace_tag(fmt, this->victimCreditsTag, this->INTERNAL_VICTIM_CREDITS_TAG);
	RenX::replace_tag(fmt, this->victimKillsTag, this->INTERNAL_VICTIM_KILLS_TAG);
	RenX::replace_tag(fmt, this->victimDeathsTag, this->INTERNAL_VICTIM_DEATHS_TAG);
	RenX::replace_tag(fmt, this->victimKDRTag, this->INTERNAL_VICTIM_KDR_TAG);
	RenX::replace_tag(fmt, this->victimSuicidesTag, this->INTERNAL_VICTIM_SUICIDES_TAG);
	RenX::replace_tag(fmt, this->victimHeadshotsTag, this->INTERNAL_VICTIM_HEADSHOTS_TAG);
	RenX::replace_tag(fmt, this->victimHeadshotKillRatioTag, this->INTERNAL_VICTIM_HEADSHOT_KILL_RATIO_TAG);
	RenX::replace_tag(fmt, this->victimVehicleKillsTag, this->INTERNAL_VICTIM_VEHICLE_KILLS_TAG);
	RenX::replace_tag(fmt, this->victimBuildingKillsTag, this->INTERNAL_VICTIM_BUILDING_KILLS_TAG);
	RenX::replace_tag(fmt, this->victimDefenceKillsTag, this->INTERNAL_VICTIM_DEFENCE_KILLS_TAG);
	RenX::replace_tag(fmt, this->victimGameTimeTag, this->INTERNAL_VICTIM_GAME_TIME_TAG);
	RenX::replace_tag(fmt, this->victimGamesTag, this->INTERNAL_VICTIM_GAMES_TAG);
	RenX::replace_tag(fmt, this->victimGDIGamesTag, this->INTERNAL_VICTIM_GDI_GAMES_TAG);
	RenX::replace_tag(fmt, this->victimNodGamesTag, this->INTERNAL_VICTIM_NOD_GAMES_TAG);
	RenX::replace_tag(fmt, this->victimWinsTag, this->INTERNAL_VICTIM_WINS_TAG);
	RenX::replace_tag(fmt, this->victimGDIWinsTag, this->INTERNAL_VICTIM_GDI_WINS_TAG);
	RenX::replace_tag(fmt, this->victimNodWinsTag, this->INTERNAL_VICTIM_NOD_WINS_TAG);
	RenX::replace_tag(fmt, this->victimTiesTag, this->INTERNAL_VICTIM_TIES_TAG);
	RenX::replace_tag(fmt, this->victimLossesTag, this->INTERNAL_VICTIM_LOSSES_TAG);
	RenX::replace_tag(fmt, this->victimGDILossesTag, this->INTERNAL_VICTIM_GDI_LOSSES_TAG);
	RenX::replace_tag(fmt, this->victimNodLossesTag, this->INTERNAL_VICTIM_NOD_LOSSES_TAG);
	RenX::replace_tag(fmt, this->victimWinLossRatioTag, this->INTERNAL_VICTIM_WIN_LOSS_RATIO_TAG);
	RenX::replace_tag(fmt, this->victimGDIWinLossRatioTag, this->INTERNAL_VICTIM_GDI_WIN_LOSS_RATIO_TAG);
	RenX::replace_tag(fmt, this->victimNodWinLossRatioTag, this->INTERNAL_VICTIM_NOD_WIN_LOSS_RATIO_TAG);
	RenX::replace_tag(fmt, this->victimBeaconPlacementsTag, this->INTERNAL_VICTIM_BEACON_PLACEMENTS_TAG);
	RenX::replace_tag(fmt, this->victimBeaconDisarmsTag, this->INTERNAL_VICTIM_BEACON_DISARMS_TAG);
	RenX::replace_tag(fmt, this->victimProxyPlacementsTag, this->INTERNAL_VICTIM_PROXY_PLACEMENTS_TAG);
	RenX::replace_tag(fmt, this->victimProxyDisarmsTag, this->INTERNAL_VICTIM_PROXY_DISARMS_TAG);
	RenX::replace_tag(fmt, this->victimCapturesTag, this->INTERNAL_VICTIM_CAPTURES_TAG);
	RenX::replace_tag(fmt, this->victimStealsTag, this->INTERNAL_VICTIM_STEALS_TAG);
	RenX::replace_tag(fmt, this->victimStolenTag, this->INTERNAL_VICTIM_STOLEN_TAG);
	RenX::replace_tag(fmt, this->victimAccessTag, this->INTERNAL_VICTIM_ACCESS_TAG);

	/** Building tags */
	RenX::replace_tag(fmt, this->buildingNameTag, this->INTERNAL_BUILDING_NAME_TAG);
	RenX::replace_tag(fmt, this->buildingRawNameTag, this->INTERNAL_BUILDING_RAW_NAME_TAG);
	RenX::replace_tag(fmt, this->buildingHealthTag, this->INTERNAL_BUILDING_HEALTH_TAG);
	RenX::replace_tag(fmt, this->buildingMaxHealthTag, this->INTERNAL_BUILDING_MAX_HEALTH_TAG);
	RenX::replace_tag(fmt, this->buildingHealthPercentageTag, this->INTERNAL_BUILDING_HEALTH_PERCENTAGE_TAG);
	RenX::replace_tag(fmt, this->buildingArmorTag, this->INTERNAL_BUILDING_ARMOR_TAG);
	RenX::replace_tag(fmt, this->buildingMaxArmorTag, this->INTERNAL_BUILDING_MAX_ARMOR_TAG);
	RenX::replace_tag(fmt, this->buildingArmorPercentageTag, this->INTERNAL_BUILDING_ARMOR_PERCENTAGE_TAG);
	RenX::replace_tag(fmt, this->buildingDurabilityTag, this->INTERNAL_BUILDING_DURABILITY_TAG);
	RenX::replace_tag(fmt, this->buildingMaxDurabilityTag, this->INTERNAL_BUILDING_MAX_DURABILITY_TAG);
	RenX::replace_tag(fmt, this->buildingDurabilityPercentageTag, this->INTERNAL_BUILDING_DURABILITY_PERCENTAGE_TAG);
	RenX::replace_tag(fmt, this->buildingTeamColorTag, this->INTERNAL_BUILDING_TEAM_COLOR_TAG);
	RenX::replace_tag(fmt, this->buildingTeamShortTag, this->INTERNAL_BUILDING_TEAM_SHORT_TAG);
	RenX::replace_tag(fmt, this->buildingTeamLongTag, this->INTERNAL_BUILDING_TEAM_LONG_TAG);

	/** Ladder tags */
	RenX::replace_tag(fmt, this->rankTag, this->INTERNAL_RANK_TAG);
	RenX::replace_tag(fmt, this->lastGameTag, this->INTERNAL_LAST_GAME_TAG);
	RenX::replace_tag(fmt, this->GDIScoreTag, this->INTERNAL_GDI_SCORE_TAG);
	RenX::replace_tag(fmt, this->GDISPMTag, this->INTERNAL_GDI_SPM_TAG);
	RenX::replace_tag(fmt, this->GDIGameTimeTag, this->INTERNAL_GDI_GAME_TIME_TAG);
	RenX::replace_tag(fmt, this->GDITiesTag, this->INTERNAL_GDI_TIES_TAG);
	RenX::replace_tag(fmt, this->GDIBeaconPlacementsTag, this->INTERNAL_GDI_BEACON_PLACEMENTS_TAG);
	RenX::replace_tag(fmt, this->GDIBeaconDisarmsTag, this->INTERNAL_GDI_BEACON_DISARMS_TAG);
	RenX::replace_tag(fmt, this->GDIProxyPlacementsTag, this->INTERNAL_GDI_PROXY_PLACEMENTS_TAG);
	RenX::replace_tag(fmt, this->GDIProxyDisarmsTag, this->INTERNAL_GDI_PROXY_DISARMS_TAG);
	RenX::replace_tag(fmt, this->GDIKillsTag, this->INTERNAL_GDI_KILLS_TAG);
	RenX::replace_tag(fmt, this->GDIDeathsTag, this->INTERNAL_GDI_DEATHS_TAG);
	RenX::replace_tag(fmt, this->GDIVehicleKillsTag, this->INTERNAL_GDI_VEHICLE_KILLS_TAG);
	RenX::replace_tag(fmt, this->GDIDefenceKillsTag, this->INTERNAL_GDI_DEFENCE_KILLS_TAG);
	RenX::replace_tag(fmt, this->GDIBuildingKillsTag, this->INTERNAL_GDI_BUILDING_KILLS_TAG);
	RenX::replace_tag(fmt, this->GDIKDRTag, this->INTERNAL_GDI_KDR_TAG);
	RenX::replace_tag(fmt, this->GDIHeadshotsTag, this->INTERNAL_GDI_HEADSHOTS_TAG);
	RenX::replace_tag(fmt, this->GDIHeadshotKillRatioTag, this->INTERNAL_GDI_HEADSHOT_KILL_RATIO_TAG);
	RenX::replace_tag(fmt, this->NodScoreTag, this->INTERNAL_NOD_SCORE_TAG);
	RenX::replace_tag(fmt, this->NodSPMTag, this->INTERNAL_NOD_SPM_TAG);
	RenX::replace_tag(fmt, this->NodGameTimeTag, this->INTERNAL_NOD_GAME_TIME_TAG);
	RenX::replace_tag(fmt, this->NodTiesTag, this->INTERNAL_NOD_TIES_TAG);
	RenX::replace_tag(fmt, this->NodBeaconPlacementsTag, this->INTERNAL_NOD_BEACON_PLACEMENTS_TAG);
	RenX::replace_tag(fmt, this->NodBeaconDisarmsTag, this->INTERNAL_NOD_BEACON_DISARMS_TAG);
	RenX::replace_tag(fmt, this->NodProxyPlacementsTag, this->INTERNAL_NOD_PROXY_PLACEMENTS_TAG);
	RenX::replace_tag(fmt, this->NodProxyDisarmsTag, this->INTERNAL_NOD_PROXY_DISARMS_TAG);
	RenX::replace_tag(fmt, this->NodKillsTag, this->INTERNAL_NOD_KILLS_TAG);
	RenX::replace_tag(fmt, this->NodDeathsTag, this->INTERNAL_NOD_DEATHS_TAG);
	RenX::replace_tag(fmt, this->NodVehicleKillsTag, this->INTERNAL_NOD_VEHICLE_KILLS_TAG);
	RenX::replace_tag(fmt, this->NodDefenceKillsTag, this->INTERNAL_NOD_DEFENCE_KILLS_TAG);
	RenX::replace_tag(fmt, this->NodBuildingKillsTag, this->INTERNAL_NOD_BUILDING_KILLS_TAG);
	RenX::replace_tag(fmt, this->NodKDRTag, this->INTERNAL_NOD_KDR_TAG);
	RenX::replace_tag(fmt, this->NodHeadshotsTag, this->INTERNAL_NOD_HEADSHOTS_TAG);
	RenX::replace_tag(fmt, this->NodHeadshotKillRatioTag, this->INTERNAL_NOD_HEADSHOT_KILL_RATIO_TAG);

	/** Other tags */
	RenX::replace_tag(fmt, this->weaponTag, this->INTERNAL_WEAPON_TAG);
	RenX::replace_tag(fmt, this->objectTag, this->INTERNAL_OBJECT_TAG);
	RenX::replace_tag(fmt, this->messageTag, this->INTERNAL_MESSAGE_TAG);
	RenX::replace_tag(fmt, this->newNameTag, this->INTERNAL_NEW_NAME_TAG);
	RenX::replace_tag(fmt, this->winScoreTag, this->INTERNAL_WIN_SCORE_TAG);
	RenX::replace_tag(fmt, this->loseScoreTag, this->INTERNAL_LOSE_SCORE_TAG);

	for (const auto& plugin : RenX::getCore()->getPlugins()) {
		plugin->RenX_SanitizeTags(fmt);
	}
}